

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  bool bVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  byte bVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar66 [16];
  undefined4 uVar61;
  undefined1 auVar67 [16];
  float fVar62;
  undefined1 auVar71 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar94;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar93;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 extraout_var [56];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vint4 ai_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar147;
  float fVar148;
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar149;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [32];
  float fVar153;
  undefined8 uVar154;
  float fVar175;
  vfloat4 b0_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar173;
  float fVar176;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  vfloat4 a0_3;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  float fVar237;
  float fVar249;
  float fVar250;
  vfloat4 a0_1;
  undefined1 auVar238 [16];
  float fVar251;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  vfloat4 a0;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar270 [16];
  undefined1 auVar274 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar54;
  undefined1 auVar92 [64];
  undefined1 auVar115 [32];
  
  PVar2 = prim[1];
  uVar59 = (ulong)(byte)PVar2;
  fVar60 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar123._0_4_ = fVar60 * auVar8._0_4_;
  auVar123._4_4_ = fVar60 * auVar8._4_4_;
  auVar123._8_4_ = fVar60 * auVar8._8_4_;
  auVar123._12_4_ = fVar60 * auVar8._12_4_;
  auVar133._0_4_ = fVar60 * auVar9._0_4_;
  auVar133._4_4_ = fVar60 * auVar9._4_4_;
  auVar133._8_4_ = fVar60 * auVar9._8_4_;
  auVar133._12_4_ = fVar60 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar59 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar53 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar59 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar53 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar261._4_4_ = auVar133._0_4_;
  auVar261._0_4_ = auVar133._0_4_;
  auVar261._8_4_ = auVar133._0_4_;
  auVar261._12_4_ = auVar133._0_4_;
  auVar73 = vshufps_avx(auVar133,auVar133,0x55);
  auVar199 = vshufps_avx(auVar133,auVar133,0xaa);
  fVar60 = auVar199._0_4_;
  auVar229._0_4_ = fVar60 * auVar265._0_4_;
  fVar132 = auVar199._4_4_;
  auVar229._4_4_ = fVar132 * auVar265._4_4_;
  fVar147 = auVar199._8_4_;
  auVar229._8_4_ = fVar147 * auVar265._8_4_;
  fVar148 = auVar199._12_4_;
  auVar229._12_4_ = fVar148 * auVar265._12_4_;
  auVar219._0_4_ = auVar12._0_4_ * fVar60;
  auVar219._4_4_ = auVar12._4_4_ * fVar132;
  auVar219._8_4_ = auVar12._8_4_ * fVar147;
  auVar219._12_4_ = auVar12._12_4_ * fVar148;
  auVar193._0_4_ = auVar95._0_4_ * fVar60;
  auVar193._4_4_ = auVar95._4_4_ * fVar132;
  auVar193._8_4_ = auVar95._8_4_ * fVar147;
  auVar193._12_4_ = auVar95._12_4_ * fVar148;
  auVar199 = vfmadd231ps_fma(auVar229,auVar73,auVar9);
  auVar74 = vfmadd231ps_fma(auVar219,auVar73,auVar11);
  auVar73 = vfmadd231ps_fma(auVar193,auVar63,auVar73);
  auVar106 = vfmadd231ps_fma(auVar199,auVar261,auVar8);
  auVar74 = vfmadd231ps_fma(auVar74,auVar261,auVar10);
  auVar119 = vfmadd231ps_fma(auVar73,auVar64,auVar261);
  auVar262._4_4_ = auVar123._0_4_;
  auVar262._0_4_ = auVar123._0_4_;
  auVar262._8_4_ = auVar123._0_4_;
  auVar262._12_4_ = auVar123._0_4_;
  auVar73 = vshufps_avx(auVar123,auVar123,0x55);
  auVar199 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar60 = auVar199._0_4_;
  auVar134._0_4_ = fVar60 * auVar265._0_4_;
  fVar132 = auVar199._4_4_;
  auVar134._4_4_ = fVar132 * auVar265._4_4_;
  fVar147 = auVar199._8_4_;
  auVar134._8_4_ = fVar147 * auVar265._8_4_;
  fVar148 = auVar199._12_4_;
  auVar134._12_4_ = fVar148 * auVar265._12_4_;
  auVar72._0_4_ = auVar12._0_4_ * fVar60;
  auVar72._4_4_ = auVar12._4_4_ * fVar132;
  auVar72._8_4_ = auVar12._8_4_ * fVar147;
  auVar72._12_4_ = auVar12._12_4_ * fVar148;
  auVar199._0_4_ = auVar95._0_4_ * fVar60;
  auVar199._4_4_ = auVar95._4_4_ * fVar132;
  auVar199._8_4_ = auVar95._8_4_ * fVar147;
  auVar199._12_4_ = auVar95._12_4_ * fVar148;
  auVar9 = vfmadd231ps_fma(auVar134,auVar73,auVar9);
  auVar265 = vfmadd231ps_fma(auVar72,auVar73,auVar11);
  auVar11 = vfmadd231ps_fma(auVar199,auVar73,auVar63);
  auVar12 = vfmadd231ps_fma(auVar9,auVar262,auVar8);
  auVar63 = vfmadd231ps_fma(auVar265,auVar262,auVar10);
  auVar95 = vfmadd231ps_fma(auVar11,auVar262,auVar64);
  auVar270._8_4_ = 0x7fffffff;
  auVar270._0_8_ = 0x7fffffff7fffffff;
  auVar270._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar106,auVar270);
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar118,1);
  auVar9 = vblendvps_avx(auVar106,auVar118,auVar8);
  auVar8 = vandps_avx(auVar74,auVar270);
  auVar8 = vcmpps_avx(auVar8,auVar118,1);
  auVar265 = vblendvps_avx(auVar74,auVar118,auVar8);
  auVar8 = vandps_avx(auVar119,auVar270);
  auVar8 = vcmpps_avx(auVar8,auVar118,1);
  auVar8 = vblendvps_avx(auVar119,auVar118,auVar8);
  auVar10 = vrcpps_avx(auVar9);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = &DAT_3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar180);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar265);
  auVar265 = vfnmadd213ps_fma(auVar265,auVar9,auVar180);
  auVar11 = vfmadd132ps_fma(auVar265,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar180);
  auVar64 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar12);
  auVar119._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar119._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar119._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar119._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar12);
  auVar135._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar135._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar135._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar135._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar74._1_3_ = 0;
  auVar74[0] = PVar2;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar265);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar59 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar10);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar63);
  auVar194._0_4_ = auVar8._0_4_ * auVar11._0_4_;
  auVar194._4_4_ = auVar8._4_4_ * auVar11._4_4_;
  auVar194._8_4_ = auVar8._8_4_ * auVar11._8_4_;
  auVar194._12_4_ = auVar8._12_4_ * auVar11._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar63);
  auVar73._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar73._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar73._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar73._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar53 + uVar59 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar95);
  auVar106._0_4_ = auVar64._0_4_ * auVar8._0_4_;
  auVar106._4_4_ = auVar64._4_4_ * auVar8._4_4_;
  auVar106._8_4_ = auVar64._8_4_ * auVar8._8_4_;
  auVar106._12_4_ = auVar64._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar95);
  auVar63._0_4_ = auVar64._0_4_ * auVar8._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar8._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar8._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar119,auVar135);
  auVar9 = vpminsd_avx(auVar194,auVar73);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar106,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar210._4_4_ = uVar61;
  auVar210._0_4_ = uVar61;
  auVar210._8_4_ = uVar61;
  auVar210._12_4_ = uVar61;
  auVar9 = vmaxps_avx(auVar9,auVar210);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_4a0._0_4_ = auVar8._0_4_ * 0.99999964;
  local_4a0._4_4_ = auVar8._4_4_ * 0.99999964;
  local_4a0._8_4_ = auVar8._8_4_ * 0.99999964;
  local_4a0._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar119,auVar135);
  auVar9 = vpmaxsd_avx(auVar194,auVar73);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar106,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar95._4_4_ = uVar61;
  auVar95._0_4_ = uVar61;
  auVar95._8_4_ = uVar61;
  auVar95._12_4_ = uVar61;
  auVar9 = vminps_avx(auVar9,auVar95);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar64._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar74[4] = PVar2;
  auVar74._5_3_ = 0;
  auVar74[8] = PVar2;
  auVar74._9_3_ = 0;
  auVar74[0xc] = PVar2;
  auVar74._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar74,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_4a0,auVar64,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar49 = vmovmskps_avx(auVar8);
  if (uVar49 == 0) {
    return;
  }
  uVar49 = uVar49 & 0xff;
  auVar69._16_16_ = mm_lookupmask_ps._240_16_;
  auVar69._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar69,ZEXT832(0) << 0x20,0x80);
  iVar50 = 1 << ((uint)k & 0x1f);
  auVar70._4_4_ = iVar50;
  auVar70._0_4_ = iVar50;
  auVar70._8_4_ = iVar50;
  auVar70._12_4_ = iVar50;
  auVar70._16_4_ = iVar50;
  auVar70._20_4_ = iVar50;
  auVar70._24_4_ = iVar50;
  auVar70._28_4_ = iVar50;
  auVar14 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar69 = vpand_avx2(auVar70,auVar14);
  local_360 = vpcmpeqd_avx2(auVar69,auVar14);
LAB_0165907c:
  lVar55 = 0;
  uVar59 = (ulong)uVar49;
  for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar49 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar55 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar49].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar8 = *(undefined1 (*) [16])(_Var7 + uVar53 * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 1) * (long)pvVar6);
  auVar265 = *(undefined1 (*) [16])(_Var7 + (uVar53 + 2) * (long)pvVar6);
  auVar10 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar53 + 3));
  lVar55 = *(long *)&pGVar4[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * uVar53);
  auVar12 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 1));
  auVar64 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  auVar63 = *(undefined1 (*) [16])(lVar55 + (long)p_Var5 * (uVar53 + 3));
  if (uVar59 != 0) {
    uVar58 = uVar59 - 1 & uVar59;
    for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar65._12_4_ = 0;
  auVar65._0_12_ = ZEXT812(0);
  auVar65 = auVar65 << 0x20;
  auVar75._0_4_ = auVar63._0_4_ * 0.0;
  auVar75._4_4_ = auVar63._4_4_ * 0.0;
  auVar75._8_4_ = auVar63._8_4_ * 0.0;
  auVar75._12_4_ = auVar63._12_4_ * 0.0;
  auVar199 = vfmadd231ps_fma(auVar75,auVar64,auVar65);
  auVar73 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar199);
  local_780._0_4_ = auVar11._0_4_ + auVar73._0_4_;
  local_780._4_4_ = auVar11._4_4_ + auVar73._4_4_;
  fStack_778 = auVar11._8_4_ + auVar73._8_4_;
  fStack_774 = auVar11._12_4_ + auVar73._12_4_;
  auVar263._8_4_ = 0x40400000;
  auVar263._0_8_ = 0x4040000040400000;
  auVar263._12_4_ = 0x40400000;
  auVar73 = vfmadd231ps_fma(auVar199,auVar12,auVar263);
  auVar74 = vfnmadd231ps_fma(auVar73,auVar11,auVar263);
  auVar238._0_4_ = auVar10._0_4_ * 0.0;
  auVar238._4_4_ = auVar10._4_4_ * 0.0;
  auVar238._8_4_ = auVar10._8_4_ * 0.0;
  auVar238._12_4_ = auVar10._12_4_ * 0.0;
  auVar199 = vfmadd231ps_fma(auVar238,auVar265,auVar65);
  auVar73 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar199);
  auVar252._0_4_ = auVar8._0_4_ + auVar73._0_4_;
  auVar252._4_4_ = auVar8._4_4_ + auVar73._4_4_;
  auVar252._8_4_ = auVar8._8_4_ + auVar73._8_4_;
  auVar252._12_4_ = auVar8._12_4_ + auVar73._12_4_;
  auVar73 = vfmadd231ps_fma(auVar199,auVar9,auVar263);
  auVar199 = vfnmadd231ps_fma(auVar73,auVar8,auVar263);
  auVar73 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar64,auVar63);
  auVar73 = vfmadd231ps_fma(auVar73,auVar12,auVar65);
  auVar73 = vfmadd231ps_fma(auVar73,auVar11,auVar65);
  auVar120._0_4_ = auVar63._0_4_ * 3.0;
  auVar120._4_4_ = auVar63._4_4_ * 3.0;
  auVar120._8_4_ = auVar63._8_4_ * 3.0;
  auVar120._12_4_ = auVar63._12_4_ * 3.0;
  auVar64 = vfnmadd231ps_fma(auVar120,auVar263,auVar64);
  auVar12 = vfmadd231ps_fma(auVar64,auVar65,auVar12);
  auVar64 = vfnmadd231ps_fma(auVar12,auVar65,auVar11);
  auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar265,auVar10);
  auVar11 = vfmadd231ps_fma(auVar11,auVar9,auVar65);
  auVar11 = vfmadd231ps_fma(auVar11,auVar8,auVar65);
  auVar220._0_4_ = auVar10._0_4_ * 3.0;
  auVar220._4_4_ = auVar10._4_4_ * 3.0;
  auVar220._8_4_ = auVar10._8_4_ * 3.0;
  auVar220._12_4_ = auVar10._12_4_ * 3.0;
  auVar265 = vfnmadd231ps_fma(auVar220,auVar263,auVar265);
  auVar9 = vfmadd231ps_fma(auVar265,auVar65,auVar9);
  auVar12 = vfnmadd231ps_fma(auVar9,auVar65,auVar8);
  auVar8 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar9 = vshufps_avx(auVar252,auVar252,0xc9);
  fVar149 = auVar74._0_4_;
  auVar155._0_4_ = fVar149 * auVar9._0_4_;
  fVar93 = auVar74._4_4_;
  auVar155._4_4_ = fVar93 * auVar9._4_4_;
  fVar94 = auVar74._8_4_;
  auVar155._8_4_ = fVar94 * auVar9._8_4_;
  fVar62 = auVar74._12_4_;
  auVar155._12_4_ = fVar62 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar155,auVar8,auVar252);
  auVar265 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar199,auVar199,0xc9);
  auVar156._0_4_ = fVar149 * auVar9._0_4_;
  auVar156._4_4_ = fVar93 * auVar9._4_4_;
  auVar156._8_4_ = fVar94 * auVar9._8_4_;
  auVar156._12_4_ = fVar62 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar156,auVar8,auVar199);
  auVar10 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar174 = auVar64._0_4_;
  auVar136._0_4_ = fVar174 * auVar9._0_4_;
  fVar150 = auVar64._4_4_;
  auVar136._4_4_ = fVar150 * auVar9._4_4_;
  fVar151 = auVar64._8_4_;
  auVar136._8_4_ = fVar151 * auVar9._8_4_;
  fVar152 = auVar64._12_4_;
  auVar136._12_4_ = fVar152 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar136,auVar8,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar181._0_4_ = fVar174 * auVar9._0_4_;
  auVar181._4_4_ = fVar150 * auVar9._4_4_;
  auVar181._8_4_ = fVar151 * auVar9._8_4_;
  auVar181._12_4_ = fVar152 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar181,auVar8,auVar12);
  auVar8 = vdpps_avx(auVar265,auVar265,0x7f);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar132 = auVar8._0_4_;
  auVar63 = ZEXT416((uint)fVar132);
  auVar9 = vrsqrtss_avx(auVar63,auVar63);
  fVar60 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar265,auVar10,0x7f);
  fVar147 = fVar60 * 1.5 - fVar132 * 0.5 * fVar60 * fVar60 * fVar60;
  fVar153 = auVar265._0_4_ * fVar147;
  fVar173 = auVar265._4_4_ * fVar147;
  fVar175 = auVar265._8_4_ * fVar147;
  fVar176 = auVar265._12_4_ * fVar147;
  auVar230._0_4_ = auVar10._0_4_ * fVar132;
  auVar230._4_4_ = auVar10._4_4_ * fVar132;
  auVar230._8_4_ = auVar10._8_4_ * fVar132;
  auVar230._12_4_ = auVar10._12_4_ * fVar132;
  fVar60 = auVar9._0_4_;
  auVar195._0_4_ = auVar265._0_4_ * fVar60;
  auVar195._4_4_ = auVar265._4_4_ * fVar60;
  auVar195._8_4_ = auVar265._8_4_ * fVar60;
  auVar195._12_4_ = auVar265._12_4_ * fVar60;
  auVar265 = vsubps_avx(auVar230,auVar195);
  auVar9 = vrcpss_avx(auVar63,auVar63);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar60 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar132 = auVar8._0_4_;
  auVar63 = ZEXT416((uint)fVar132);
  auVar9 = vrsqrtss_avx(auVar63,auVar63);
  fVar148 = auVar9._0_4_;
  fVar148 = fVar148 * 1.5 - fVar132 * 0.5 * fVar148 * fVar148 * fVar148;
  fVar237 = fVar148 * auVar11._0_4_;
  fVar249 = fVar148 * auVar11._4_4_;
  fVar250 = fVar148 * auVar11._8_4_;
  fVar251 = fVar148 * auVar11._12_4_;
  auVar9 = vdpps_avx(auVar11,auVar12,0x7f);
  auVar182._0_4_ = fVar132 * auVar12._0_4_;
  auVar182._4_4_ = fVar132 * auVar12._4_4_;
  auVar182._8_4_ = fVar132 * auVar12._8_4_;
  auVar182._12_4_ = fVar132 * auVar12._12_4_;
  fVar132 = auVar9._0_4_;
  auVar137._0_4_ = fVar132 * auVar11._0_4_;
  auVar137._4_4_ = fVar132 * auVar11._4_4_;
  auVar137._8_4_ = fVar132 * auVar11._8_4_;
  auVar137._12_4_ = fVar132 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar182,auVar137);
  auVar9 = vrcpss_avx(auVar63,auVar63);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar132 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(_local_780,_local_780,0xff);
  auVar211._0_4_ = auVar8._0_4_ * fVar153;
  auVar211._4_4_ = auVar8._4_4_ * fVar173;
  auVar211._8_4_ = auVar8._8_4_ * fVar175;
  auVar211._12_4_ = auVar8._12_4_ * fVar176;
  local_5b0 = vsubps_avx(_local_780,auVar211);
  auVar9 = vshufps_avx(auVar74,auVar74,0xff);
  auVar157._0_4_ = auVar9._0_4_ * fVar153 + fVar147 * auVar265._0_4_ * fVar60 * auVar8._0_4_;
  auVar157._4_4_ = auVar9._4_4_ * fVar173 + fVar147 * auVar265._4_4_ * fVar60 * auVar8._4_4_;
  auVar157._8_4_ = auVar9._8_4_ * fVar175 + fVar147 * auVar265._8_4_ * fVar60 * auVar8._8_4_;
  auVar157._12_4_ = auVar9._12_4_ * fVar176 + fVar147 * auVar265._12_4_ * fVar60 * auVar8._12_4_;
  auVar265 = vsubps_avx(auVar74,auVar157);
  local_5c0._0_4_ = auVar211._0_4_ + (float)local_780._0_4_;
  local_5c0._4_4_ = auVar211._4_4_ + (float)local_780._4_4_;
  fStack_5b8 = auVar211._8_4_ + fStack_778;
  fStack_5b4 = auVar211._12_4_ + fStack_774;
  auVar8 = vshufps_avx(auVar73,auVar73,0xff);
  auVar96._0_4_ = fVar237 * auVar8._0_4_;
  auVar96._4_4_ = fVar249 * auVar8._4_4_;
  auVar96._8_4_ = fVar250 * auVar8._8_4_;
  auVar96._12_4_ = fVar251 * auVar8._12_4_;
  local_5d0 = vsubps_avx(auVar73,auVar96);
  auVar9 = vshufps_avx(auVar64,auVar64,0xff);
  auVar76._0_4_ = fVar237 * auVar9._0_4_ + auVar8._0_4_ * fVar148 * auVar10._0_4_ * fVar132;
  auVar76._4_4_ = fVar249 * auVar9._4_4_ + auVar8._4_4_ * fVar148 * auVar10._4_4_ * fVar132;
  auVar76._8_4_ = fVar250 * auVar9._8_4_ + auVar8._8_4_ * fVar148 * auVar10._8_4_ * fVar132;
  auVar76._12_4_ = fVar251 * auVar9._12_4_ + auVar8._12_4_ * fVar148 * auVar10._12_4_ * fVar132;
  auVar8 = vsubps_avx(auVar64,auVar76);
  local_5e0._0_4_ = auVar73._0_4_ + auVar96._0_4_;
  local_5e0._4_4_ = auVar73._4_4_ + auVar96._4_4_;
  fStack_5d8 = auVar73._8_4_ + auVar96._8_4_;
  fStack_5d4 = auVar73._12_4_ + auVar96._12_4_;
  local_5f0._0_4_ = local_5b0._0_4_ + auVar265._0_4_ * 0.33333334;
  local_5f0._4_4_ = local_5b0._4_4_ + auVar265._4_4_ * 0.33333334;
  local_5f0._8_4_ = local_5b0._8_4_ + auVar265._8_4_ * 0.33333334;
  local_5f0._12_4_ = local_5b0._12_4_ + auVar265._12_4_ * 0.33333334;
  auVar77._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar8._12_4_ * 0.33333334;
  local_600 = vsubps_avx(local_5d0,auVar77);
  local_590 = vsubps_avx(local_5b0,auVar95);
  auVar8 = vshufps_avx(local_590,local_590,0x55);
  auVar9 = vshufps_avx(local_590,local_590,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar132 = pre->ray_space[k].vz.field_0.m128[1];
  fVar147 = pre->ray_space[k].vz.field_0.m128[2];
  fVar148 = pre->ray_space[k].vz.field_0.m128[3];
  auVar78._0_4_ = fVar60 * auVar9._0_4_;
  auVar78._4_4_ = fVar132 * auVar9._4_4_;
  auVar78._8_4_ = fVar147 * auVar9._8_4_;
  auVar78._12_4_ = fVar148 * auVar9._12_4_;
  auVar265 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar1,auVar8);
  local_5a0 = vsubps_avx(local_5f0,auVar95);
  auVar8 = vshufps_avx(local_5a0,local_5a0,0x55);
  auVar9 = vshufps_avx(local_5a0,local_5a0,0xaa);
  auVar79._0_4_ = fVar60 * auVar9._0_4_;
  auVar79._4_4_ = fVar132 * auVar9._4_4_;
  auVar79._8_4_ = fVar147 * auVar9._8_4_;
  auVar79._12_4_ = fVar148 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar1,auVar8);
  local_3f0 = vsubps_avx(local_600,auVar95);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar239._0_4_ = fVar60 * auVar8._0_4_;
  auVar239._4_4_ = fVar132 * auVar8._4_4_;
  auVar239._8_4_ = fVar147 * auVar8._8_4_;
  auVar239._12_4_ = fVar148 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar10 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar1,auVar8);
  local_400 = vsubps_avx(local_5d0,auVar95);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar80._0_4_ = fVar60 * auVar8._0_4_;
  auVar80._4_4_ = fVar132 * auVar8._4_4_;
  auVar80._8_4_ = fVar147 * auVar8._8_4_;
  auVar80._12_4_ = fVar148 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar11 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar1,auVar8);
  local_410 = vsubps_avx(_local_5c0,auVar95);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar138._0_4_ = fVar60 * auVar8._0_4_;
  auVar138._4_4_ = fVar132 * auVar8._4_4_;
  auVar138._8_4_ = fVar147 * auVar8._8_4_;
  auVar138._12_4_ = fVar148 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_410,local_410,0x55);
  auVar12 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar1,auVar8);
  local_610._0_4_ = (fVar149 + auVar157._0_4_) * 0.33333334 + (float)local_5c0._0_4_;
  local_610._4_4_ = (fVar93 + auVar157._4_4_) * 0.33333334 + (float)local_5c0._4_4_;
  fStack_608 = (fVar94 + auVar157._8_4_) * 0.33333334 + fStack_5b8;
  fStack_604 = (fVar62 + auVar157._12_4_) * 0.33333334 + fStack_5b4;
  local_420 = vsubps_avx(_local_610,auVar95);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar196._0_4_ = auVar8._0_4_ * fVar60;
  auVar196._4_4_ = auVar8._4_4_ * fVar132;
  auVar196._8_4_ = auVar8._8_4_ * fVar147;
  auVar196._12_4_ = auVar8._12_4_ * fVar148;
  auVar8 = vshufps_avx(local_420,local_420,0x55);
  auVar64 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar1,auVar8);
  auVar212._0_4_ = (fVar174 + auVar76._0_4_) * 0.33333334;
  auVar212._4_4_ = (fVar150 + auVar76._4_4_) * 0.33333334;
  auVar212._8_4_ = (fVar151 + auVar76._8_4_) * 0.33333334;
  auVar212._12_4_ = (fVar152 + auVar76._12_4_) * 0.33333334;
  _local_620 = vsubps_avx(_local_5e0,auVar212);
  local_430 = vsubps_avx(_local_620,auVar95);
  auVar8 = vshufps_avx(local_430,local_430,0xaa);
  auVar213._0_4_ = auVar8._0_4_ * fVar60;
  auVar213._4_4_ = auVar8._4_4_ * fVar132;
  auVar213._8_4_ = auVar8._8_4_ * fVar147;
  auVar213._12_4_ = auVar8._12_4_ * fVar148;
  auVar8 = vshufps_avx(local_430,local_430,0x55);
  auVar63 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar1,auVar8);
  local_440 = vsubps_avx(_local_5e0,auVar95);
  auVar8 = vshufps_avx(local_440,local_440,0xaa);
  auVar81._0_4_ = fVar60 * auVar8._0_4_;
  auVar81._4_4_ = fVar132 * auVar8._4_4_;
  auVar81._8_4_ = fVar147 * auVar8._8_4_;
  auVar81._12_4_ = fVar148 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_440,local_440,0x55);
  auVar8 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar1,auVar8);
  auVar158._4_4_ = local_590._0_4_;
  auVar158._0_4_ = local_590._0_4_;
  auVar158._8_4_ = local_590._0_4_;
  auVar158._12_4_ = local_590._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar95 = vfmadd231ps_fma(auVar265,(undefined1  [16])aVar1,auVar158);
  auVar159._4_4_ = local_5a0._0_4_;
  auVar159._0_4_ = local_5a0._0_4_;
  auVar159._8_4_ = local_5a0._0_4_;
  auVar159._12_4_ = local_5a0._0_4_;
  auVar73 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar159);
  uVar61 = local_3f0._0_4_;
  auVar160._4_4_ = uVar61;
  auVar160._0_4_ = uVar61;
  auVar160._8_4_ = uVar61;
  auVar160._12_4_ = uVar61;
  auVar199 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar160);
  uVar61 = local_400._0_4_;
  auVar161._4_4_ = uVar61;
  auVar161._0_4_ = uVar61;
  auVar161._8_4_ = uVar61;
  auVar161._12_4_ = uVar61;
  auVar74 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar161);
  uVar61 = local_410._0_4_;
  auVar162._4_4_ = uVar61;
  auVar162._0_4_ = uVar61;
  auVar162._8_4_ = uVar61;
  auVar162._12_4_ = uVar61;
  auVar106 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar162);
  uVar61 = local_420._0_4_;
  auVar163._4_4_ = uVar61;
  auVar163._0_4_ = uVar61;
  auVar163._8_4_ = uVar61;
  auVar163._12_4_ = uVar61;
  auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar163);
  uVar61 = local_430._0_4_;
  auVar164._4_4_ = uVar61;
  auVar164._0_4_ = uVar61;
  auVar164._8_4_ = uVar61;
  auVar164._12_4_ = uVar61;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar1,auVar164);
  uVar61 = local_440._0_4_;
  auVar165._4_4_ = uVar61;
  auVar165._0_4_ = uVar61;
  auVar165._8_4_ = uVar61;
  auVar165._12_4_ = uVar61;
  auVar119 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar165);
  auVar10 = vmovlhps_avx(auVar95,auVar106);
  auVar11 = vmovlhps_avx(auVar73,auVar64);
  auVar12 = vmovlhps_avx(auVar199,auVar63);
  _local_580 = vmovlhps_avx(auVar74,auVar119);
  auVar8 = vminps_avx(auVar10,auVar11);
  auVar9 = vminps_avx(auVar12,_local_580);
  auVar265 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar10,auVar11);
  auVar9 = vmaxps_avx(auVar12,_local_580);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar265,auVar265,3);
  auVar265 = vminps_avx(auVar265,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar270,auVar265);
  auVar9 = vandps_avx(auVar270,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  local_2e0 = auVar8._0_4_ * 9.536743e-07;
  local_500._8_8_ = auVar95._0_8_;
  local_500._0_8_ = auVar95._0_8_;
  local_510._8_8_ = auVar73._0_8_;
  local_510._0_8_ = auVar73._0_8_;
  local_520._0_8_ = auVar199._0_8_;
  local_520._8_8_ = local_520._0_8_;
  local_780 = auVar74._0_8_;
  local_530._8_8_ = local_780;
  local_530._0_8_ = local_780;
  local_540 = auVar106._0_8_;
  register0x00001348 = local_540;
  register0x000013c8 = auVar64._0_8_;
  local_550 = auVar64._0_8_;
  register0x00001408 = auVar63._0_8_;
  local_560 = auVar63._0_8_;
  register0x00001448 = auVar119._0_8_;
  local_570 = auVar119._0_8_;
  local_3e0 = ZEXT416((uint)local_2e0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_300 = -local_2e0;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_320 = uVar49;
  uStack_31c = uVar49;
  uStack_318 = uVar49;
  uStack_314 = uVar49;
  uStack_310 = uVar49;
  uStack_30c = uVar49;
  uStack_308 = uVar49;
  uStack_304 = uVar49;
  local_340 = uVar3;
  uStack_33c = uVar3;
  uStack_338 = uVar3;
  uStack_334 = uVar3;
  uStack_330 = uVar3;
  uStack_32c = uVar3;
  uStack_328 = uVar3;
  uStack_324 = uVar3;
  uVar53 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x60);
  local_3b0 = vsubps_avx(auVar11,auVar10);
  local_3c0 = vsubps_avx(auVar12,auVar11);
  local_3d0 = vsubps_avx(_local_580,auVar12);
  local_460 = vsubps_avx(_local_5c0,local_5b0);
  local_470 = vsubps_avx(_local_610,local_5f0);
  local_480 = vsubps_avx(_local_620,local_600);
  _local_490 = vsubps_avx(_local_5e0,local_5d0);
  _local_780 = ZEXT816(0x3f80000000000000);
  local_450 = _local_780;
  do {
    auVar8 = vshufps_avx(_local_780,_local_780,0x50);
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = &DAT_3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._0_16_ = auVar107;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar107,auVar8);
    fVar132 = auVar8._0_4_;
    auVar66._0_4_ = local_540._0_4_ * fVar132;
    fVar147 = auVar8._4_4_;
    auVar66._4_4_ = local_540._4_4_ * fVar147;
    fVar148 = auVar8._8_4_;
    auVar66._8_4_ = local_540._8_4_ * fVar148;
    fVar149 = auVar8._12_4_;
    auVar66._12_4_ = local_540._12_4_ * fVar149;
    auVar139._0_4_ = local_550._0_4_ * fVar132;
    auVar139._4_4_ = local_550._4_4_ * fVar147;
    auVar139._8_4_ = local_550._8_4_ * fVar148;
    auVar139._12_4_ = local_550._12_4_ * fVar149;
    auVar183._0_4_ = local_560._0_4_ * fVar132;
    auVar183._4_4_ = local_560._4_4_ * fVar147;
    auVar183._8_4_ = local_560._8_4_ * fVar148;
    auVar183._12_4_ = local_560._12_4_ * fVar149;
    auVar264._0_4_ = local_570._0_4_ * fVar132;
    auVar264._4_4_ = local_570._4_4_ * fVar147;
    auVar264._8_4_ = local_570._8_4_ * fVar148;
    auVar264._12_4_ = local_570._12_4_ * fVar149;
    auVar63 = vfmadd231ps_fma(auVar66,auVar9,local_500);
    auVar95 = vfmadd231ps_fma(auVar139,auVar9,local_510);
    auVar73 = vfmadd231ps_fma(auVar183,auVar9,local_520);
    auVar199 = vfmadd231ps_fma(auVar264,local_530,auVar9);
    local_6e0 = auVar199._0_4_;
    auVar8 = vmovshdup_avx(local_450);
    fVar132 = local_450._0_4_;
    fVar93 = (auVar8._0_4_ - fVar132) * 0.04761905;
    auVar209._4_4_ = fVar132;
    auVar209._0_4_ = fVar132;
    auVar209._8_4_ = fVar132;
    auVar209._12_4_ = fVar132;
    auVar209._16_4_ = fVar132;
    auVar209._20_4_ = fVar132;
    auVar209._24_4_ = fVar132;
    auVar209._28_4_ = fVar132;
    auVar103._0_8_ = auVar8._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    auVar69 = vsubps_avx(auVar103,auVar209);
    uVar61 = auVar63._0_4_;
    auVar274._4_4_ = uVar61;
    auVar274._0_4_ = uVar61;
    auVar274._8_4_ = uVar61;
    auVar274._12_4_ = uVar61;
    auVar274._16_4_ = uVar61;
    auVar274._20_4_ = uVar61;
    auVar274._24_4_ = uVar61;
    auVar274._28_4_ = uVar61;
    auVar8 = vmovshdup_avx(auVar63);
    uVar154 = auVar8._0_8_;
    auVar259._8_8_ = uVar154;
    auVar259._0_8_ = uVar154;
    auVar259._16_8_ = uVar154;
    auVar259._24_8_ = uVar154;
    fVar94 = auVar95._0_4_;
    auVar89._4_4_ = fVar94;
    auVar89._0_4_ = fVar94;
    auVar89._8_4_ = fVar94;
    auVar89._12_4_ = fVar94;
    auVar89._16_4_ = fVar94;
    auVar89._20_4_ = fVar94;
    auVar89._24_4_ = fVar94;
    auVar89._28_4_ = fVar94;
    auVar9 = vmovshdup_avx(auVar95);
    auVar170._0_8_ = auVar9._0_8_;
    auVar170._8_8_ = auVar170._0_8_;
    auVar170._16_8_ = auVar170._0_8_;
    auVar170._24_8_ = auVar170._0_8_;
    fVar150 = auVar73._0_4_;
    auVar236._4_4_ = fVar150;
    auVar236._0_4_ = fVar150;
    auVar236._8_4_ = fVar150;
    auVar236._12_4_ = fVar150;
    auVar236._16_4_ = fVar150;
    auVar236._20_4_ = fVar150;
    auVar236._24_4_ = fVar150;
    auVar236._28_4_ = fVar150;
    auVar265 = vmovshdup_avx(auVar73);
    auVar218._0_8_ = auVar265._0_8_;
    auVar218._8_8_ = auVar218._0_8_;
    auVar218._16_8_ = auVar218._0_8_;
    auVar218._24_8_ = auVar218._0_8_;
    auVar64 = vmovshdup_avx(auVar199);
    auVar74 = vfmadd132ps_fma(auVar69,auVar209,_DAT_02020f20);
    auVar69 = vsubps_avx(auVar115,ZEXT1632(auVar74));
    fVar132 = auVar74._0_4_;
    auVar267._0_4_ = fVar94 * fVar132;
    fVar147 = auVar74._4_4_;
    auVar267._4_4_ = fVar94 * fVar147;
    fVar148 = auVar74._8_4_;
    auVar267._8_4_ = fVar94 * fVar148;
    fVar149 = auVar74._12_4_;
    auVar267._12_4_ = fVar94 * fVar149;
    auVar267._16_4_ = fVar94 * 0.0;
    auVar267._20_4_ = fVar94 * 0.0;
    auVar267._24_4_ = fVar94 * 0.0;
    auVar267._28_4_ = 0;
    auVar74 = vfmadd231ps_fma(auVar267,auVar69,auVar274);
    fVar62 = auVar9._0_4_;
    auVar246._0_4_ = fVar62 * fVar132;
    fVar174 = auVar9._4_4_;
    auVar246._4_4_ = fVar174 * fVar147;
    auVar246._8_4_ = fVar62 * fVar148;
    auVar246._12_4_ = fVar174 * fVar149;
    auVar246._16_4_ = fVar62 * 0.0;
    auVar246._20_4_ = fVar174 * 0.0;
    auVar246._24_4_ = fVar62 * 0.0;
    auVar246._28_4_ = 0;
    auVar106 = vfmadd231ps_fma(auVar246,auVar69,auVar259);
    auVar14._4_4_ = fVar150 * fVar147;
    auVar14._0_4_ = fVar150 * fVar132;
    auVar14._8_4_ = fVar150 * fVar148;
    auVar14._12_4_ = fVar150 * fVar149;
    auVar14._16_4_ = fVar150 * 0.0;
    auVar14._20_4_ = fVar150 * 0.0;
    auVar14._24_4_ = fVar150 * 0.0;
    auVar14._28_4_ = auVar8._4_4_;
    auVar119 = vfmadd231ps_fma(auVar14,auVar69,auVar89);
    fVar62 = auVar265._0_4_;
    fVar174 = auVar265._4_4_;
    auVar71._4_4_ = fVar174 * fVar147;
    auVar71._0_4_ = fVar62 * fVar132;
    auVar71._8_4_ = fVar62 * fVar148;
    auVar71._12_4_ = fVar174 * fVar149;
    auVar71._16_4_ = fVar62 * 0.0;
    auVar71._20_4_ = fVar174 * 0.0;
    auVar71._24_4_ = fVar62 * 0.0;
    auVar71._28_4_ = uVar61;
    auVar123 = vfmadd231ps_fma(auVar71,auVar69,auVar170);
    auVar8 = vshufps_avx(auVar63,auVar63,0xaa);
    auVar171._0_8_ = auVar8._0_8_;
    auVar171._8_8_ = auVar171._0_8_;
    auVar171._16_8_ = auVar171._0_8_;
    auVar171._24_8_ = auVar171._0_8_;
    auVar9 = vshufps_avx(auVar63,auVar63,0xff);
    uStack_6f8 = auVar9._0_8_;
    local_700 = (undefined1  [8])uStack_6f8;
    uStack_6f0 = uStack_6f8;
    uStack_6e8 = uStack_6f8;
    auVar13._4_4_ = fVar147 * local_6e0;
    auVar13._0_4_ = fVar132 * local_6e0;
    auVar13._8_4_ = fVar148 * local_6e0;
    auVar13._12_4_ = fVar149 * local_6e0;
    auVar13._16_4_ = local_6e0 * 0.0;
    auVar13._20_4_ = local_6e0 * 0.0;
    auVar13._24_4_ = local_6e0 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar72 = vfmadd231ps_fma(auVar13,auVar69,auVar236);
    auVar265 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar130._0_8_ = auVar265._0_8_;
    auVar130._8_8_ = auVar130._0_8_;
    auVar130._16_8_ = auVar130._0_8_;
    auVar130._24_8_ = auVar130._0_8_;
    auVar63 = vshufps_avx(auVar95,auVar95,0xff);
    auVar146._0_8_ = auVar63._0_8_;
    auVar146._8_8_ = auVar146._0_8_;
    auVar146._16_8_ = auVar146._0_8_;
    auVar146._24_8_ = auVar146._0_8_;
    fVar62 = auVar64._0_4_;
    fVar174 = auVar64._4_4_;
    auVar15._4_4_ = fVar174 * fVar147;
    auVar15._0_4_ = fVar62 * fVar132;
    auVar15._8_4_ = fVar62 * fVar148;
    auVar15._12_4_ = fVar174 * fVar149;
    auVar15._16_4_ = fVar62 * 0.0;
    auVar15._20_4_ = fVar174 * 0.0;
    auVar15._24_4_ = fVar62 * 0.0;
    auVar15._28_4_ = fVar150;
    auVar118 = vfmadd231ps_fma(auVar15,auVar69,auVar218);
    auVar16._28_4_ = fVar94;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar119._12_4_ * fVar149,
                            CONCAT48(auVar119._8_4_ * fVar148,
                                     CONCAT44(auVar119._4_4_ * fVar147,auVar119._0_4_ * fVar132))));
    auVar74 = vfmadd231ps_fma(auVar16,auVar69,ZEXT1632(auVar74));
    auVar17._28_4_ = auVar9._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar149,
                            CONCAT48(auVar123._8_4_ * fVar148,
                                     CONCAT44(auVar123._4_4_ * fVar147,auVar123._0_4_ * fVar132))));
    auVar106 = vfmadd231ps_fma(auVar17,auVar69,ZEXT1632(auVar106));
    auVar9 = vshufps_avx(auVar73,auVar73,0xaa);
    uVar154 = auVar9._0_8_;
    auVar247._8_8_ = uVar154;
    auVar247._0_8_ = uVar154;
    auVar247._16_8_ = uVar154;
    auVar247._24_8_ = uVar154;
    auVar64 = vshufps_avx(auVar73,auVar73,0xff);
    uVar154 = auVar64._0_8_;
    auVar268._8_8_ = uVar154;
    auVar268._0_8_ = uVar154;
    auVar268._16_8_ = uVar154;
    auVar268._24_8_ = uVar154;
    auVar119 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar72._12_4_,
                                                  CONCAT48(fVar148 * auVar72._8_4_,
                                                           CONCAT44(fVar147 * auVar72._4_4_,
                                                                    fVar132 * auVar72._0_4_)))),
                               auVar69,ZEXT1632(auVar119));
    auVar95 = vshufps_avx(auVar199,auVar199,0xaa);
    auVar73 = vshufps_avx(auVar199,auVar199,0xff);
    local_6e0 = auVar73._0_4_;
    fStack_6dc = auVar73._4_4_;
    auVar248._28_4_ = fStack_6dc;
    auVar248._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar149,
                            CONCAT48(auVar118._8_4_ * fVar148,
                                     CONCAT44(auVar118._4_4_ * fVar147,auVar118._0_4_ * fVar132))));
    auVar73 = vfmadd231ps_fma(auVar248,auVar69,ZEXT1632(auVar123));
    auVar199 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar119._12_4_,
                                                  CONCAT48(fVar148 * auVar119._8_4_,
                                                           CONCAT44(fVar147 * auVar119._4_4_,
                                                                    fVar132 * auVar119._0_4_)))),
                               auVar69,ZEXT1632(auVar74));
    auVar14 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar74));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar73._12_4_,
                                                 CONCAT48(fVar148 * auVar73._8_4_,
                                                          CONCAT44(fVar147 * auVar73._4_4_,
                                                                   fVar132 * auVar73._0_4_)))),
                              auVar69,ZEXT1632(auVar106));
    auVar70 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar106));
    fVar153 = fVar93 * auVar14._0_4_ * 3.0;
    fVar175 = fVar93 * auVar14._4_4_ * 3.0;
    auVar18._4_4_ = fVar175;
    auVar18._0_4_ = fVar153;
    fVar237 = fVar93 * auVar14._8_4_ * 3.0;
    auVar18._8_4_ = fVar237;
    fVar250 = fVar93 * auVar14._12_4_ * 3.0;
    auVar18._12_4_ = fVar250;
    fVar226 = fVar93 * auVar14._16_4_ * 3.0;
    auVar18._16_4_ = fVar226;
    fVar227 = fVar93 * auVar14._20_4_ * 3.0;
    auVar18._20_4_ = fVar227;
    fVar228 = fVar93 * auVar14._24_4_ * 3.0;
    auVar18._24_4_ = fVar228;
    auVar18._28_4_ = 0x40400000;
    local_720._0_4_ = fVar93 * auVar70._0_4_ * 3.0;
    local_720._4_4_ = fVar93 * auVar70._4_4_ * 3.0;
    fStack_718 = fVar93 * auVar70._8_4_ * 3.0;
    fStack_714 = fVar93 * auVar70._12_4_ * 3.0;
    fStack_710 = fVar93 * auVar70._16_4_ * 3.0;
    fStack_70c = fVar93 * auVar70._20_4_ * 3.0;
    fStack_708 = fVar93 * auVar70._24_4_ * 3.0;
    fStack_704 = auVar70._28_4_;
    fVar94 = auVar265._0_4_;
    fVar62 = auVar265._4_4_;
    auVar19._4_4_ = fVar62 * fVar147;
    auVar19._0_4_ = fVar94 * fVar132;
    auVar19._8_4_ = fVar94 * fVar148;
    auVar19._12_4_ = fVar62 * fVar149;
    auVar19._16_4_ = fVar94 * 0.0;
    auVar19._20_4_ = fVar62 * 0.0;
    auVar19._24_4_ = fVar94 * 0.0;
    auVar19._28_4_ = auVar14._28_4_;
    auVar265 = vfmadd231ps_fma(auVar19,auVar69,auVar171);
    fVar94 = auVar63._0_4_;
    fVar174 = auVar63._4_4_;
    auVar20._4_4_ = fVar174 * fVar147;
    auVar20._0_4_ = fVar94 * fVar132;
    auVar20._8_4_ = fVar94 * fVar148;
    auVar20._12_4_ = fVar174 * fVar149;
    auVar20._16_4_ = fVar94 * 0.0;
    auVar20._20_4_ = fVar174 * 0.0;
    auVar20._24_4_ = fVar94 * 0.0;
    auVar20._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar20,auVar69,_local_700);
    fVar94 = auVar9._0_4_;
    fVar174 = auVar9._4_4_;
    auVar21._4_4_ = fVar174 * fVar147;
    auVar21._0_4_ = fVar94 * fVar132;
    auVar21._8_4_ = fVar94 * fVar148;
    auVar21._12_4_ = fVar174 * fVar149;
    auVar21._16_4_ = fVar94 * 0.0;
    auVar21._20_4_ = fVar174 * 0.0;
    auVar21._24_4_ = fVar94 * 0.0;
    auVar21._28_4_ = fVar93;
    auVar9 = vfmadd231ps_fma(auVar21,auVar69,auVar130);
    fVar94 = auVar64._0_4_;
    fVar150 = auVar64._4_4_;
    auVar22._4_4_ = fVar150 * fVar147;
    auVar22._0_4_ = fVar94 * fVar132;
    auVar22._8_4_ = fVar94 * fVar148;
    auVar22._12_4_ = fVar150 * fVar149;
    auVar22._16_4_ = fVar94 * 0.0;
    auVar22._20_4_ = fVar150 * 0.0;
    auVar22._24_4_ = fVar94 * 0.0;
    auVar22._28_4_ = fVar62;
    auVar64 = vfmadd231ps_fma(auVar22,auVar69,auVar146);
    local_4e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar199));
    fVar94 = auVar95._0_4_;
    fVar62 = auVar95._4_4_;
    auVar23._4_4_ = fVar62 * fVar147;
    auVar23._0_4_ = fVar94 * fVar132;
    auVar23._8_4_ = fVar94 * fVar148;
    auVar23._12_4_ = fVar62 * fVar149;
    auVar23._16_4_ = fVar94 * 0.0;
    auVar23._20_4_ = fVar62 * 0.0;
    auVar23._24_4_ = fVar94 * 0.0;
    auVar23._28_4_ = local_4e0._28_4_;
    auVar63 = vfmadd231ps_fma(auVar23,auVar69,auVar247);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar74));
    auVar24._4_4_ = fVar147 * fStack_6dc;
    auVar24._0_4_ = fVar132 * local_6e0;
    auVar24._8_4_ = fVar148 * local_6e0;
    auVar24._12_4_ = fVar149 * fStack_6dc;
    auVar24._16_4_ = local_6e0 * 0.0;
    auVar24._20_4_ = fStack_6dc * 0.0;
    auVar24._24_4_ = local_6e0 * 0.0;
    auVar24._28_4_ = fVar174;
    auVar95 = vfmadd231ps_fma(auVar24,auVar69,auVar268);
    auVar25._28_4_ = fVar62;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar149 * auVar9._12_4_,
                            CONCAT48(fVar148 * auVar9._8_4_,
                                     CONCAT44(fVar147 * auVar9._4_4_,fVar132 * auVar9._0_4_))));
    auVar265 = vfmadd231ps_fma(auVar25,auVar69,ZEXT1632(auVar265));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar64._12_4_,
                                                CONCAT48(fVar148 * auVar64._8_4_,
                                                         CONCAT44(fVar147 * auVar64._4_4_,
                                                                  fVar132 * auVar64._0_4_)))),
                             auVar69,ZEXT1632(auVar8));
    fVar153 = auVar199._0_4_ + fVar153;
    fVar175 = auVar199._4_4_ + fVar175;
    fVar237 = auVar199._8_4_ + fVar237;
    fVar250 = auVar199._12_4_ + fVar250;
    fVar226 = fVar226 + 0.0;
    fVar227 = fVar227 + 0.0;
    fVar228 = fVar228 + 0.0;
    auVar26._28_4_ = 0x40400000;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar95._12_4_ * fVar149,
                            CONCAT48(auVar95._8_4_ * fVar148,
                                     CONCAT44(auVar95._4_4_ * fVar147,auVar95._0_4_ * fVar132))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar63._12_4_,
                                                CONCAT48(fVar148 * auVar63._8_4_,
                                                         CONCAT44(fVar147 * auVar63._4_4_,
                                                                  fVar132 * auVar63._0_4_)))),
                             auVar69,ZEXT1632(auVar9));
    auVar64 = vfmadd231ps_fma(auVar26,auVar69,ZEXT1632(auVar64));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar9._12_4_,
                                                 CONCAT48(fVar148 * auVar9._8_4_,
                                                          CONCAT44(fVar147 * auVar9._4_4_,
                                                                   fVar132 * auVar9._0_4_)))),
                              auVar69,ZEXT1632(auVar265));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar64._12_4_,
                                                 CONCAT48(fVar148 * auVar64._8_4_,
                                                          CONCAT44(fVar147 * auVar64._4_4_,
                                                                   fVar132 * auVar64._0_4_)))),
                              ZEXT1632(auVar8),auVar69);
    auVar69 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar265));
    auVar14 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar8));
    fVar132 = fVar93 * auVar69._0_4_ * 3.0;
    fVar147 = fVar93 * auVar69._4_4_ * 3.0;
    auVar27._4_4_ = fVar147;
    auVar27._0_4_ = fVar132;
    fVar148 = fVar93 * auVar69._8_4_ * 3.0;
    auVar27._8_4_ = fVar148;
    fVar149 = fVar93 * auVar69._12_4_ * 3.0;
    auVar27._12_4_ = fVar149;
    fVar150 = fVar93 * auVar69._16_4_ * 3.0;
    auVar27._16_4_ = fVar150;
    fVar151 = fVar93 * auVar69._20_4_ * 3.0;
    auVar27._20_4_ = fVar151;
    fVar152 = fVar93 * auVar69._24_4_ * 3.0;
    auVar27._24_4_ = fVar152;
    auVar27._28_4_ = 0x40400000;
    auVar192._0_4_ = fVar93 * auVar14._0_4_ * 3.0;
    auVar192._4_4_ = fVar93 * auVar14._4_4_ * 3.0;
    auVar192._8_4_ = fVar93 * auVar14._8_4_ * 3.0;
    auVar192._12_4_ = fVar93 * auVar14._12_4_ * 3.0;
    auVar192._16_4_ = fVar93 * auVar14._16_4_ * 3.0;
    auVar192._20_4_ = fVar93 * auVar14._20_4_ * 3.0;
    auVar192._24_4_ = fVar93 * auVar14._24_4_ * 3.0;
    auVar192._28_4_ = 0;
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar63));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar95));
    auVar69 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar199));
    auVar14 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar74));
    auVar71 = vsubps_avx(auVar16,local_4e0);
    fVar173 = auVar69._0_4_ + auVar71._0_4_;
    fVar176 = auVar69._4_4_ + auVar71._4_4_;
    fVar249 = auVar69._8_4_ + auVar71._8_4_;
    fVar251 = auVar69._12_4_ + auVar71._12_4_;
    fVar177 = auVar69._16_4_ + auVar71._16_4_;
    fVar178 = auVar69._20_4_ + auVar71._20_4_;
    fVar179 = auVar69._24_4_ + auVar71._24_4_;
    auVar13 = vsubps_avx(local_1c0,auVar15);
    auVar260._0_4_ = auVar14._0_4_ + auVar13._0_4_;
    auVar260._4_4_ = auVar14._4_4_ + auVar13._4_4_;
    auVar260._8_4_ = auVar14._8_4_ + auVar13._8_4_;
    auVar260._12_4_ = auVar14._12_4_ + auVar13._12_4_;
    auVar260._16_4_ = auVar14._16_4_ + auVar13._16_4_;
    auVar260._20_4_ = auVar14._20_4_ + auVar13._20_4_;
    auVar260._24_4_ = auVar14._24_4_ + auVar13._24_4_;
    auVar260._28_4_ = auVar14._28_4_ + auVar13._28_4_;
    fVar93 = auVar74._0_4_;
    local_2a0 = fVar93 + (float)local_720._0_4_;
    fVar94 = auVar74._4_4_;
    fStack_29c = fVar94 + (float)local_720._4_4_;
    fVar62 = auVar74._8_4_;
    fStack_298 = fVar62 + fStack_718;
    fVar174 = auVar74._12_4_;
    fStack_294 = fVar174 + fStack_714;
    fStack_290 = fStack_710 + 0.0;
    fStack_28c = fStack_70c + 0.0;
    fStack_288 = fStack_708 + 0.0;
    fStack_284 = auVar70._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar199);
    auVar14 = vsubps_avx(local_1e0,auVar18);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_200 = ZEXT1632(auVar74);
    auVar14 = vsubps_avx(local_200,_local_720);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_240._0_4_ = auVar63._0_4_ + fVar132;
    local_240._4_4_ = auVar63._4_4_ + fVar147;
    local_240._8_4_ = auVar63._8_4_ + fVar148;
    local_240._12_4_ = auVar63._12_4_ + fVar149;
    local_240._16_4_ = fVar150 + 0.0;
    local_240._20_4_ = fVar151 + 0.0;
    local_240._24_4_ = fVar152 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar248 = ZEXT1632(auVar63);
    auVar14 = vsubps_avx(auVar248,auVar27);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    fVar132 = auVar95._0_4_;
    local_280._0_4_ = fVar132 + auVar192._0_4_;
    fVar147 = auVar95._4_4_;
    local_280._4_4_ = fVar147 + auVar192._4_4_;
    fVar148 = auVar95._8_4_;
    local_280._8_4_ = fVar148 + auVar192._8_4_;
    fVar149 = auVar95._12_4_;
    local_280._12_4_ = fVar149 + auVar192._12_4_;
    local_280._16_4_ = auVar192._16_4_ + 0.0;
    local_280._20_4_ = auVar192._20_4_ + 0.0;
    local_280._24_4_ = auVar192._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT1632(auVar95),auVar192);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    auVar28._4_4_ = fVar94 * fVar176;
    auVar28._0_4_ = fVar93 * fVar173;
    auVar28._8_4_ = fVar62 * fVar249;
    auVar28._12_4_ = fVar174 * fVar251;
    auVar28._16_4_ = fVar177 * 0.0;
    auVar28._20_4_ = fVar178 * 0.0;
    auVar28._24_4_ = fVar179 * 0.0;
    auVar28._28_4_ = auVar14._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar28,local_1e0,auVar260);
    auVar29._4_4_ = fStack_29c * fVar176;
    auVar29._0_4_ = local_2a0 * fVar173;
    auVar29._8_4_ = fStack_298 * fVar249;
    auVar29._12_4_ = fStack_294 * fVar251;
    auVar29._16_4_ = fStack_290 * fVar177;
    auVar29._20_4_ = fStack_28c * fVar178;
    auVar29._24_4_ = fStack_288 * fVar179;
    auVar29._28_4_ = auVar17._28_4_;
    auVar42._4_4_ = fVar175;
    auVar42._0_4_ = fVar153;
    auVar42._8_4_ = fVar237;
    auVar42._12_4_ = fVar250;
    auVar42._16_4_ = fVar226;
    auVar42._20_4_ = fVar227;
    auVar42._24_4_ = fVar228;
    auVar42._28_4_ = 0x40400000;
    auVar9 = vfnmadd231ps_fma(auVar29,auVar260,auVar42);
    auVar30._4_4_ = local_2c0._4_4_ * fVar176;
    auVar30._0_4_ = local_2c0._0_4_ * fVar173;
    auVar30._8_4_ = local_2c0._8_4_ * fVar249;
    auVar30._12_4_ = local_2c0._12_4_ * fVar251;
    auVar30._16_4_ = local_2c0._16_4_ * fVar177;
    auVar30._20_4_ = local_2c0._20_4_ * fVar178;
    auVar30._24_4_ = local_2c0._24_4_ * fVar179;
    auVar30._28_4_ = fStack_284;
    auVar265 = vfnmadd231ps_fma(auVar30,local_220,auVar260);
    local_700._0_4_ = auVar15._0_4_;
    local_700._4_4_ = auVar15._4_4_;
    uStack_6f8._0_4_ = auVar15._8_4_;
    uStack_6f8._4_4_ = auVar15._12_4_;
    uStack_6f0._0_4_ = auVar15._16_4_;
    uStack_6f0._4_4_ = auVar15._20_4_;
    uStack_6e8._0_4_ = auVar15._24_4_;
    auVar31._4_4_ = fVar176 * (float)local_700._4_4_;
    auVar31._0_4_ = fVar173 * (float)local_700._0_4_;
    auVar31._8_4_ = fVar249 * (float)uStack_6f8;
    auVar31._12_4_ = fVar251 * uStack_6f8._4_4_;
    auVar31._16_4_ = fVar177 * (float)uStack_6f0;
    auVar31._20_4_ = fVar178 * uStack_6f0._4_4_;
    auVar31._24_4_ = fVar179 * (float)uStack_6e8;
    auVar31._28_4_ = local_2c0._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar31,local_4e0,auVar260);
    auVar48._4_4_ = fVar147 * fVar176;
    auVar48._0_4_ = fVar132 * fVar173;
    auVar48._8_4_ = fVar148 * fVar249;
    auVar48._12_4_ = fVar149 * fVar251;
    auVar48._16_4_ = fVar177 * 0.0;
    auVar48._20_4_ = fVar178 * 0.0;
    auVar48._24_4_ = fVar179 * 0.0;
    auVar48._28_4_ = DAT_0205d4a0._28_4_;
    auVar63 = vfnmadd231ps_fma(auVar48,auVar248,auVar260);
    auVar32._4_4_ = local_280._4_4_ * fVar176;
    auVar32._0_4_ = local_280._0_4_ * fVar173;
    auVar32._8_4_ = local_280._8_4_ * fVar249;
    auVar32._12_4_ = local_280._12_4_ * fVar251;
    auVar32._16_4_ = local_280._16_4_ * fVar177;
    auVar32._20_4_ = local_280._20_4_ * fVar178;
    auVar32._24_4_ = local_280._24_4_ * fVar179;
    auVar32._28_4_ = local_4e0._28_4_;
    auVar73 = vfnmadd231ps_fma(auVar32,local_240,auVar260);
    auVar33._4_4_ = local_260._4_4_ * fVar176;
    auVar33._0_4_ = local_260._0_4_ * fVar173;
    auVar33._8_4_ = local_260._8_4_ * fVar249;
    auVar33._12_4_ = local_260._12_4_ * fVar251;
    auVar33._16_4_ = local_260._16_4_ * fVar177;
    auVar33._20_4_ = local_260._20_4_ * fVar178;
    auVar33._24_4_ = local_260._24_4_ * fVar179;
    auVar33._28_4_ = local_220._28_4_;
    auVar199 = vfnmadd231ps_fma(auVar33,auVar260,auVar17);
    auVar34._4_4_ = local_1c0._4_4_ * fVar176;
    auVar34._0_4_ = local_1c0._0_4_ * fVar173;
    auVar34._8_4_ = local_1c0._8_4_ * fVar249;
    auVar34._12_4_ = local_1c0._12_4_ * fVar251;
    auVar34._16_4_ = local_1c0._16_4_ * fVar177;
    auVar34._20_4_ = local_1c0._20_4_ * fVar178;
    auVar34._24_4_ = local_1c0._24_4_ * fVar179;
    auVar34._28_4_ = auVar69._28_4_ + auVar71._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar34,auVar260,auVar16);
    auVar14 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar69 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar70 = vminps_avx(ZEXT1632(auVar265),ZEXT1632(auVar64));
    auVar70 = vminps_avx(auVar14,auVar70);
    auVar14 = vmaxps_avx(ZEXT1632(auVar265),ZEXT1632(auVar64));
    auVar69 = vmaxps_avx(auVar69,auVar14);
    auVar71 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar73));
    auVar14 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar73));
    auVar13 = vminps_avx(ZEXT1632(auVar199),ZEXT1632(auVar74));
    auVar71 = vminps_avx(auVar71,auVar13);
    auVar71 = vminps_avx(auVar70,auVar71);
    auVar70 = vmaxps_avx(ZEXT1632(auVar199),ZEXT1632(auVar74));
    auVar14 = vmaxps_avx(auVar14,auVar70);
    auVar14 = vmaxps_avx(auVar69,auVar14);
    auVar47._4_4_ = fStack_2dc;
    auVar47._0_4_ = local_2e0;
    auVar47._8_4_ = fStack_2d8;
    auVar47._12_4_ = fStack_2d4;
    auVar47._16_4_ = fStack_2d0;
    auVar47._20_4_ = fStack_2cc;
    auVar47._24_4_ = fStack_2c8;
    auVar47._28_4_ = fStack_2c4;
    auVar69 = vcmpps_avx(auVar71,auVar47,2);
    auVar46._4_4_ = fStack_2fc;
    auVar46._0_4_ = local_300;
    auVar46._8_4_ = fStack_2f8;
    auVar46._12_4_ = fStack_2f4;
    auVar46._16_4_ = fStack_2f0;
    auVar46._20_4_ = fStack_2ec;
    auVar46._24_4_ = fStack_2e8;
    auVar46._28_4_ = fStack_2e4;
    auVar14 = vcmpps_avx(auVar14,auVar46,5);
    auVar69 = vandps_avx(auVar14,auVar69);
    auVar14 = local_3a0 & auVar69;
    uVar51 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_4e0,local_1e0);
      auVar70 = vsubps_avx(auVar16,auVar248);
      fVar151 = auVar14._0_4_ + auVar70._0_4_;
      fVar152 = auVar14._4_4_ + auVar70._4_4_;
      fVar173 = auVar14._8_4_ + auVar70._8_4_;
      fVar176 = auVar14._12_4_ + auVar70._12_4_;
      fVar249 = auVar14._16_4_ + auVar70._16_4_;
      fVar251 = auVar14._20_4_ + auVar70._20_4_;
      fVar177 = auVar14._24_4_ + auVar70._24_4_;
      auVar71 = vsubps_avx(auVar15,local_200);
      auVar13 = vsubps_avx(local_1c0,ZEXT1632(auVar95));
      auVar90._0_4_ = auVar71._0_4_ + auVar13._0_4_;
      auVar90._4_4_ = auVar71._4_4_ + auVar13._4_4_;
      auVar90._8_4_ = auVar71._8_4_ + auVar13._8_4_;
      auVar90._12_4_ = auVar71._12_4_ + auVar13._12_4_;
      auVar90._16_4_ = auVar71._16_4_ + auVar13._16_4_;
      auVar90._20_4_ = auVar71._20_4_ + auVar13._20_4_;
      auVar90._24_4_ = auVar71._24_4_ + auVar13._24_4_;
      fVar150 = auVar13._28_4_;
      auVar90._28_4_ = auVar71._28_4_ + fVar150;
      auVar269._0_4_ = fVar93 * fVar151;
      auVar269._4_4_ = fVar94 * fVar152;
      auVar269._8_4_ = fVar62 * fVar173;
      auVar269._12_4_ = fVar174 * fVar176;
      auVar269._16_4_ = fVar249 * 0.0;
      auVar269._20_4_ = fVar251 * 0.0;
      auVar269._24_4_ = fVar177 * 0.0;
      auVar269._28_4_ = 0;
      auVar63 = vfnmadd231ps_fma(auVar269,auVar90,local_1e0);
      auVar35._4_4_ = fVar152 * fStack_29c;
      auVar35._0_4_ = fVar151 * local_2a0;
      auVar35._8_4_ = fVar173 * fStack_298;
      auVar35._12_4_ = fVar176 * fStack_294;
      auVar35._16_4_ = fVar249 * fStack_290;
      auVar35._20_4_ = fVar251 * fStack_28c;
      auVar35._24_4_ = fVar177 * fStack_288;
      auVar35._28_4_ = fVar150;
      auVar43._4_4_ = fVar175;
      auVar43._0_4_ = fVar153;
      auVar43._8_4_ = fVar237;
      auVar43._12_4_ = fVar250;
      auVar43._16_4_ = fVar226;
      auVar43._20_4_ = fVar227;
      auVar43._24_4_ = fVar228;
      auVar43._28_4_ = 0x40400000;
      auVar8 = vfnmadd213ps_fma(auVar43,auVar90,auVar35);
      auVar36._4_4_ = fVar152 * local_2c0._4_4_;
      auVar36._0_4_ = fVar151 * local_2c0._0_4_;
      auVar36._8_4_ = fVar173 * local_2c0._8_4_;
      auVar36._12_4_ = fVar176 * local_2c0._12_4_;
      auVar36._16_4_ = fVar249 * local_2c0._16_4_;
      auVar36._20_4_ = fVar251 * local_2c0._20_4_;
      auVar36._24_4_ = fVar177 * local_2c0._24_4_;
      auVar36._28_4_ = fVar150;
      auVar9 = vfnmadd213ps_fma(local_220,auVar90,auVar36);
      auVar37._4_4_ = (float)local_700._4_4_ * fVar152;
      auVar37._0_4_ = (float)local_700._0_4_ * fVar151;
      auVar37._8_4_ = (float)uStack_6f8 * fVar173;
      auVar37._12_4_ = uStack_6f8._4_4_ * fVar176;
      auVar37._16_4_ = (float)uStack_6f0 * fVar249;
      auVar37._20_4_ = uStack_6f0._4_4_ * fVar251;
      auVar37._24_4_ = (float)uStack_6e8 * fVar177;
      auVar37._28_4_ = fVar150;
      auVar95 = vfnmadd231ps_fma(auVar37,auVar90,local_4e0);
      auVar104._0_4_ = fVar132 * fVar151;
      auVar104._4_4_ = fVar147 * fVar152;
      auVar104._8_4_ = fVar148 * fVar173;
      auVar104._12_4_ = fVar149 * fVar176;
      auVar104._16_4_ = fVar249 * 0.0;
      auVar104._20_4_ = fVar251 * 0.0;
      auVar104._24_4_ = fVar177 * 0.0;
      auVar104._28_4_ = 0;
      auVar73 = vfnmadd231ps_fma(auVar104,auVar90,auVar248);
      auVar38._4_4_ = fVar152 * local_280._4_4_;
      auVar38._0_4_ = fVar151 * local_280._0_4_;
      auVar38._8_4_ = fVar173 * local_280._8_4_;
      auVar38._12_4_ = fVar176 * local_280._12_4_;
      auVar38._16_4_ = fVar249 * local_280._16_4_;
      auVar38._20_4_ = fVar251 * local_280._20_4_;
      auVar38._24_4_ = fVar177 * local_280._24_4_;
      auVar38._28_4_ = auVar15._28_4_;
      auVar265 = vfnmadd213ps_fma(local_240,auVar90,auVar38);
      auVar39._4_4_ = fVar152 * local_260._4_4_;
      auVar39._0_4_ = fVar151 * local_260._0_4_;
      auVar39._8_4_ = fVar173 * local_260._8_4_;
      auVar39._12_4_ = fVar176 * local_260._12_4_;
      auVar39._16_4_ = fVar249 * local_260._16_4_;
      auVar39._20_4_ = fVar251 * local_260._20_4_;
      auVar39._24_4_ = fVar177 * local_260._24_4_;
      auVar39._28_4_ = auVar15._28_4_;
      auVar64 = vfnmadd213ps_fma(auVar17,auVar90,auVar39);
      auVar40._4_4_ = local_1c0._4_4_ * fVar152;
      auVar40._0_4_ = local_1c0._0_4_ * fVar151;
      auVar40._8_4_ = local_1c0._8_4_ * fVar173;
      auVar40._12_4_ = local_1c0._12_4_ * fVar176;
      auVar40._16_4_ = local_1c0._16_4_ * fVar249;
      auVar40._20_4_ = local_1c0._20_4_ * fVar251;
      auVar40._24_4_ = local_1c0._24_4_ * fVar177;
      auVar40._28_4_ = auVar14._28_4_ + auVar70._28_4_;
      auVar199 = vfnmadd231ps_fma(auVar40,auVar90,auVar16);
      auVar70 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar8));
      auVar14 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar8));
      auVar71 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar95));
      auVar71 = vminps_avx(auVar70,auVar71);
      auVar70 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar95));
      auVar14 = vmaxps_avx(auVar14,auVar70);
      auVar13 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar265));
      auVar70 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar265));
      auVar15 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar199));
      auVar13 = vminps_avx(auVar13,auVar15);
      auVar13 = vminps_avx(auVar71,auVar13);
      auVar71 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar199));
      auVar70 = vmaxps_avx(auVar70,auVar71);
      auVar70 = vmaxps_avx(auVar14,auVar70);
      auVar14 = vcmpps_avx(auVar13,auVar47,2);
      auVar70 = vcmpps_avx(auVar70,auVar46,5);
      auVar14 = vandps_avx(auVar70,auVar14);
      auVar69 = vandps_avx(auVar69,local_3a0);
      auVar70 = auVar69 & auVar14;
      if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar70 >> 0x7f,0) != '\0') ||
            (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar70 >> 0xbf,0) != '\0') ||
          (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar70[0x1f] < '\0') {
        auVar69 = vandps_avx(auVar14,auVar69);
        uVar51 = vmovmskps_avx(auVar69);
      }
    }
    if (uVar51 != 0) {
      auStack_4f0[uVar53] = uVar51;
      uVar154 = vmovlps_avx(local_450);
      *(undefined8 *)(&uStack_380 + uVar53 * 2) = uVar154;
      uVar58 = vmovlps_avx(_local_780);
      auStack_1a0[uVar53] = uVar58;
      uVar53 = (ulong)((int)uVar53 + 1);
    }
    do {
      if ((int)uVar53 == 0) {
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar68._4_4_ = uVar61;
        auVar68._0_4_ = uVar61;
        auVar68._8_4_ = uVar61;
        auVar68._12_4_ = uVar61;
        auVar8 = vcmpps_avx(local_4a0,auVar68,2);
        uVar49 = vmovmskps_avx(auVar8);
        uVar49 = (uint)uVar59 & uVar49;
        if (uVar49 == 0) {
          return;
        }
        goto LAB_0165907c;
      }
      uVar52 = (int)uVar53 - 1;
      uVar54 = (ulong)uVar52;
      uVar57 = auStack_4f0[uVar54];
      uVar51 = (&uStack_380)[uVar54 * 2];
      fVar132 = afStack_37c[uVar54 * 2];
      iVar50 = 0;
      for (uVar58 = (ulong)uVar57; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        iVar50 = iVar50 + 1;
      }
      uVar57 = uVar57 - 1 & uVar57;
      if (uVar57 == 0) {
        uVar53 = (ulong)uVar52;
      }
      register0x00001348 = 0;
      local_780 = (undefined1  [8])auStack_1a0[uVar54];
      auStack_4f0[uVar54] = uVar57;
      fVar147 = (float)(iVar50 + 1) * 0.14285715;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * (float)iVar50 * 0.14285715)),ZEXT416(uVar51)
                               ,ZEXT416((uint)(1.0 - (float)iVar50 * 0.14285715)));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar147)),ZEXT416(uVar51),
                               ZEXT416((uint)(1.0 - fVar147)));
      auVar172._0_4_ = auVar8._0_4_;
      fVar147 = auVar9._0_4_;
      fVar132 = fVar147 - auVar172._0_4_;
      if (0.16666667 <= fVar132) break;
      auVar265 = vshufps_avx(_local_780,_local_780,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = &DAT_3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar64 = vsubps_avx(auVar97,auVar265);
      fVar148 = auVar265._0_4_;
      auVar108._0_4_ = fVar148 * (float)local_540._0_4_;
      fVar149 = auVar265._4_4_;
      auVar108._4_4_ = fVar149 * (float)local_540._4_4_;
      fVar93 = auVar265._8_4_;
      auVar108._8_4_ = fVar93 * fStack_538;
      fVar94 = auVar265._12_4_;
      auVar108._12_4_ = fVar94 * fStack_534;
      auVar121._0_4_ = fVar148 * (float)local_550._0_4_;
      auVar121._4_4_ = fVar149 * (float)local_550._4_4_;
      auVar121._8_4_ = fVar93 * fStack_548;
      auVar121._12_4_ = fVar94 * fStack_544;
      auVar140._0_4_ = fVar148 * (float)local_560._0_4_;
      auVar140._4_4_ = fVar149 * (float)local_560._4_4_;
      auVar140._8_4_ = fVar93 * fStack_558;
      auVar140._12_4_ = fVar94 * fStack_554;
      auVar82._0_4_ = fVar148 * (float)local_570._0_4_;
      auVar82._4_4_ = fVar149 * (float)local_570._4_4_;
      auVar82._8_4_ = fVar93 * fStack_568;
      auVar82._12_4_ = fVar94 * fStack_564;
      auVar265 = vfmadd231ps_fma(auVar108,auVar64,local_500);
      auVar63 = vfmadd231ps_fma(auVar121,auVar64,local_510);
      auVar95 = vfmadd231ps_fma(auVar140,auVar64,local_520);
      auVar64 = vfmadd231ps_fma(auVar82,auVar64,local_530);
      auVar105._16_16_ = auVar265;
      auVar105._0_16_ = auVar265;
      auVar116._16_16_ = auVar63;
      auVar116._0_16_ = auVar63;
      auVar131._16_16_ = auVar95;
      auVar131._0_16_ = auVar95;
      auVar172._4_4_ = auVar172._0_4_;
      auVar172._8_4_ = auVar172._0_4_;
      auVar172._12_4_ = auVar172._0_4_;
      auVar172._20_4_ = fVar147;
      auVar172._16_4_ = fVar147;
      auVar172._24_4_ = fVar147;
      auVar172._28_4_ = fVar147;
      auVar69 = vsubps_avx(auVar116,auVar105);
      auVar63 = vfmadd213ps_fma(auVar69,auVar172,auVar105);
      auVar69 = vsubps_avx(auVar131,auVar116);
      auVar73 = vfmadd213ps_fma(auVar69,auVar172,auVar116);
      auVar265 = vsubps_avx(auVar64,auVar95);
      auVar117._16_16_ = auVar265;
      auVar117._0_16_ = auVar265;
      auVar265 = vfmadd213ps_fma(auVar117,auVar172,auVar131);
      auVar69 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar63));
      auVar64 = vfmadd213ps_fma(auVar69,auVar172,ZEXT1632(auVar63));
      auVar69 = vsubps_avx(ZEXT1632(auVar265),ZEXT1632(auVar73));
      auVar265 = vfmadd213ps_fma(auVar69,auVar172,ZEXT1632(auVar73));
      auVar69 = vsubps_avx(ZEXT1632(auVar265),ZEXT1632(auVar64));
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar69,auVar172);
      fVar174 = auVar69._4_4_ * 3.0;
      fVar62 = fVar132 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar106._4_4_ + fVar62 * fVar174,auVar106._0_4_ + fVar62 * auVar69._0_4_ * 3.0)
      ;
      local_4e0._8_4_ = auVar106._8_4_ + fVar62 * auVar69._8_4_ * 3.0;
      local_4e0._12_4_ = auVar106._12_4_ + fVar62 * auVar69._12_4_ * 3.0;
      auVar64 = vshufpd_avx(auVar106,auVar106,3);
      auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar265 = vsubps_avx(auVar64,auVar106);
      auVar95 = vsubps_avx(auVar63,(undefined1  [16])0x0);
      auVar98._0_4_ = auVar265._0_4_ + auVar95._0_4_;
      auVar98._4_4_ = auVar265._4_4_ + auVar95._4_4_;
      auVar98._8_4_ = auVar265._8_4_ + auVar95._8_4_;
      auVar98._12_4_ = auVar265._12_4_ + auVar95._12_4_;
      auVar265 = vshufps_avx(auVar106,auVar106,0xb1);
      auVar95 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar253._4_4_ = auVar98._0_4_;
      auVar253._0_4_ = auVar98._0_4_;
      auVar253._8_4_ = auVar98._0_4_;
      auVar253._12_4_ = auVar98._0_4_;
      auVar73 = vshufps_avx(auVar98,auVar98,0x55);
      fVar148 = auVar73._0_4_;
      auVar184._0_4_ = auVar265._0_4_ * fVar148;
      fVar149 = auVar73._4_4_;
      auVar184._4_4_ = auVar265._4_4_ * fVar149;
      fVar93 = auVar73._8_4_;
      auVar184._8_4_ = auVar265._8_4_ * fVar93;
      fVar94 = auVar73._12_4_;
      auVar184._12_4_ = auVar265._12_4_ * fVar94;
      auVar197._0_4_ = auVar95._0_4_ * fVar148;
      auVar197._4_4_ = auVar95._4_4_ * fVar149;
      auVar197._8_4_ = auVar95._8_4_ * fVar93;
      auVar197._12_4_ = auVar95._12_4_ * fVar94;
      auVar199 = vfmadd231ps_fma(auVar184,auVar253,auVar106);
      auVar74 = vfmadd231ps_fma(auVar197,auVar253,local_4e0._0_16_);
      auVar95 = vshufps_avx(auVar199,auVar199,0xe8);
      auVar73 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar265 = vcmpps_avx(auVar95,auVar73,1);
      uVar51 = vextractps_avx(auVar265,0);
      auVar119 = auVar74;
      if ((uVar51 & 1) == 0) {
        auVar119 = auVar199;
      }
      auVar122._0_4_ = fVar62 * auVar69._16_4_ * 3.0;
      auVar122._4_4_ = fVar62 * fVar174;
      auVar122._8_4_ = fVar62 * auVar69._24_4_ * 3.0;
      auVar122._12_4_ = fVar62 * fVar147;
      auVar133 = vsubps_avx((undefined1  [16])0x0,auVar122);
      auVar123 = vshufps_avx(auVar133,auVar133,0xb1);
      auVar72 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar271._0_4_ = auVar123._0_4_ * fVar148;
      auVar271._4_4_ = auVar123._4_4_ * fVar149;
      auVar271._8_4_ = auVar123._8_4_ * fVar93;
      auVar271._12_4_ = auVar123._12_4_ * fVar94;
      auVar99._0_4_ = auVar72._0_4_ * fVar148;
      auVar99._4_4_ = auVar72._4_4_ * fVar149;
      auVar99._8_4_ = auVar72._8_4_ * fVar93;
      auVar99._12_4_ = auVar72._12_4_ * fVar94;
      auVar134 = vfmadd231ps_fma(auVar271,auVar253,auVar133);
      auVar135 = vfmadd231ps_fma(auVar99,(undefined1  [16])0x0,auVar253);
      auVar72 = vshufps_avx(auVar134,auVar134,0xe8);
      auVar118 = vshufps_avx(auVar135,auVar135,0xe8);
      auVar123 = vcmpps_avx(auVar72,auVar118,1);
      uVar51 = vextractps_avx(auVar123,0);
      auVar180 = auVar135;
      if ((uVar51 & 1) == 0) {
        auVar180 = auVar134;
      }
      auVar119 = vmaxss_avx(auVar180,auVar119);
      auVar95 = vminps_avx(auVar95,auVar73);
      auVar73 = vminps_avx(auVar72,auVar118);
      auVar73 = vminps_avx(auVar95,auVar73);
      auVar265 = vshufps_avx(auVar265,auVar265,0x55);
      auVar265 = vblendps_avx(auVar265,auVar123,2);
      auVar123 = vpslld_avx(auVar265,0x1f);
      auVar265 = vshufpd_avx(auVar74,auVar74,1);
      auVar265 = vinsertps_avx(auVar265,auVar135,0x9c);
      auVar95 = vshufpd_avx(auVar199,auVar199,1);
      auVar95 = vinsertps_avx(auVar95,auVar134,0x9c);
      auVar265 = vblendvps_avx(auVar95,auVar265,auVar123);
      auVar95 = vmovshdup_avx(auVar265);
      auVar265 = vmaxss_avx(auVar95,auVar265);
      fVar93 = auVar73._0_4_;
      auVar95 = vmovshdup_avx(auVar73);
      fVar149 = auVar265._0_4_;
      fVar148 = auVar119._0_4_;
      if ((0.0001 <= fVar93) || (fVar149 <= -0.0001)) {
        auVar199 = vcmpps_avx(auVar95,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar74 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar199 = vorps_avx(auVar74,auVar199);
        if ((-0.0001 < fVar148 & auVar199[0]) != 0) goto LAB_0165a128;
        auVar199 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar265,5);
        auVar74 = vcmpps_avx(auVar95,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar199 = vorps_avx(auVar74,auVar199);
        if ((auVar199 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0165a128;
LAB_0165aae1:
        bVar41 = true;
      }
      else {
LAB_0165a128:
        auVar74 = vcmpps_avx(auVar73,_DAT_01feba10,1);
        auVar123 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar199 = vcmpss_avx(auVar119,ZEXT816(0) << 0x20,1);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = &DAT_3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar198._8_4_ = 0xbf800000;
        auVar198._0_8_ = 0xbf800000bf800000;
        auVar198._12_4_ = 0xbf800000;
        auVar199 = vblendvps_avx(auVar141,auVar198,auVar199);
        auVar74 = vblendvps_avx(auVar141,auVar198,auVar74);
        fVar94 = auVar74._0_4_;
        fVar62 = auVar199._0_4_;
        auVar199 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar94 == fVar62) && (!NAN(fVar94) && !NAN(fVar62))) {
          auVar199 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar72 = ZEXT816(0) << 0x20;
        if ((fVar94 == fVar62) && (!NAN(fVar94) && !NAN(fVar62))) {
          auVar123 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar74 = vmovshdup_avx(auVar74);
        fVar174 = auVar74._0_4_;
        if ((fVar94 != fVar174) || (NAN(fVar94) || NAN(fVar174))) {
          fVar94 = auVar95._0_4_;
          if ((fVar94 != fVar93) || (NAN(fVar94) || NAN(fVar93))) {
            auVar100._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar100._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar100._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar124._0_4_ = -fVar93 / (fVar94 - fVar93);
            auVar124._4_12_ = auVar100._4_12_;
            auVar95 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar72,auVar124);
            auVar73 = auVar95;
          }
          else {
            auVar95 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar93 == 0.0) && (auVar95 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar93))) {
              auVar95 = ZEXT816(0);
            }
            auVar73 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar93 == 0.0) && (auVar73 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar93))) {
              auVar73 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar199 = vminss_avx(auVar199,auVar95);
          auVar123 = vmaxss_avx(auVar73,auVar123);
        }
        auVar265 = vcmpss_avx(auVar265,auVar72,1);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = &DAT_3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar142._8_4_ = 0xbf800000;
        auVar142._0_8_ = 0xbf800000bf800000;
        auVar142._12_4_ = 0xbf800000;
        auVar265 = vblendvps_avx(auVar125,auVar142,auVar265);
        fVar93 = auVar265._0_4_;
        auVar265 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar62 != fVar93) || (NAN(fVar62) || NAN(fVar93))) {
          if ((fVar149 != fVar148) || (NAN(fVar149) || NAN(fVar148))) {
            auVar101._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = auVar119._8_4_ ^ 0x80000000;
            auVar101._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar126._0_4_ = -fVar148 / (fVar149 - fVar148);
            auVar126._4_12_ = auVar101._4_12_;
            auVar95 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar72,auVar126);
            auVar73 = auVar95;
          }
          else {
            auVar95 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar148 == 0.0) && (auVar95 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar148))) {
              auVar95 = ZEXT816(0);
            }
            auVar73 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar148 == 0.0) && (auVar73 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar148))) {
              auVar73 = auVar265;
            }
          }
          auVar199 = vminss_avx(auVar199,auVar95);
          auVar123 = vmaxss_avx(auVar73,auVar123);
        }
        if ((fVar174 != fVar93) || (NAN(fVar174) || NAN(fVar93))) {
          auVar199 = vminss_avx(auVar199,auVar265);
          auVar123 = vmaxss_avx(auVar265,auVar123);
        }
        auVar95 = vmaxss_avx(auVar72,auVar199);
        auVar73 = vminss_avx(auVar123,auVar265);
        bVar41 = true;
        if (auVar95._0_4_ <= auVar73._0_4_) {
          auVar95 = vmaxss_avx(auVar72,ZEXT416((uint)(auVar95._0_4_ + -0.1)));
          auVar265 = vminss_avx(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar265);
          auVar83._0_8_ = auVar106._0_8_;
          auVar83._8_8_ = auVar83._0_8_;
          auVar200._8_8_ = local_4e0._0_8_;
          auVar200._0_8_ = local_4e0._0_8_;
          auVar214._8_8_ = auVar133._0_8_;
          auVar214._0_8_ = auVar133._0_8_;
          auVar73 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
          auVar199 = vshufpd_avx(auVar133,auVar133,3);
          auVar74 = vshufps_avx(auVar95,auVar265,0);
          auVar109._8_4_ = 0x3f800000;
          auVar109._0_8_ = &DAT_3f8000003f800000;
          auVar109._12_4_ = 0x3f800000;
          auVar106 = vsubps_avx(auVar109,auVar74);
          local_720._0_4_ = auVar64._0_4_;
          local_720._4_4_ = auVar64._4_4_;
          fStack_718 = auVar64._8_4_;
          fStack_714 = auVar64._12_4_;
          fVar148 = auVar74._0_4_;
          auVar110._0_4_ = fVar148 * (float)local_720._0_4_;
          fVar149 = auVar74._4_4_;
          auVar110._4_4_ = fVar149 * (float)local_720._4_4_;
          fVar93 = auVar74._8_4_;
          auVar110._8_4_ = fVar93 * fStack_718;
          fVar94 = auVar74._12_4_;
          auVar110._12_4_ = fVar94 * fStack_714;
          auVar127._0_4_ = auVar73._0_4_ * fVar148;
          auVar127._4_4_ = auVar73._4_4_ * fVar149;
          auVar127._8_4_ = auVar73._8_4_ * fVar93;
          auVar127._12_4_ = auVar73._12_4_ * fVar94;
          auVar143._0_4_ = auVar199._0_4_ * fVar148;
          auVar143._4_4_ = auVar199._4_4_ * fVar149;
          auVar143._8_4_ = auVar199._8_4_ * fVar93;
          auVar143._12_4_ = auVar199._12_4_ * fVar94;
          local_700._0_4_ = auVar63._0_4_;
          local_700._4_4_ = auVar63._4_4_;
          uStack_6f8._0_4_ = auVar63._8_4_;
          uStack_6f8._4_4_ = auVar63._12_4_;
          auVar166._0_4_ = fVar148 * (float)local_700._0_4_;
          auVar166._4_4_ = fVar149 * (float)local_700._4_4_;
          auVar166._8_4_ = fVar93 * (float)uStack_6f8;
          auVar166._12_4_ = fVar94 * uStack_6f8._4_4_;
          auVar73 = vfmadd231ps_fma(auVar110,auVar106,auVar83);
          auVar199 = vfmadd231ps_fma(auVar127,auVar106,auVar200);
          auVar74 = vfmadd231ps_fma(auVar143,auVar106,auVar214);
          auVar106 = vfmadd231ps_fma(auVar166,auVar106,ZEXT816(0));
          auVar64 = vmovshdup_avx(_local_780);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar95._0_4_)),_local_780,
                                    ZEXT416((uint)(1.0 - auVar95._0_4_)));
          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar265._0_4_)),_local_780,
                                     ZEXT416((uint)(1.0 - auVar265._0_4_)));
          fVar148 = 1.0 / fVar132;
          auVar265 = vsubps_avx(auVar199,auVar73);
          auVar185._0_4_ = auVar265._0_4_ * 3.0;
          auVar185._4_4_ = auVar265._4_4_ * 3.0;
          auVar185._8_4_ = auVar265._8_4_ * 3.0;
          auVar185._12_4_ = auVar265._12_4_ * 3.0;
          auVar265 = vsubps_avx(auVar74,auVar199);
          auVar201._0_4_ = auVar265._0_4_ * 3.0;
          auVar201._4_4_ = auVar265._4_4_ * 3.0;
          auVar201._8_4_ = auVar265._8_4_ * 3.0;
          auVar201._12_4_ = auVar265._12_4_ * 3.0;
          auVar265 = vsubps_avx(auVar106,auVar74);
          auVar215._0_4_ = auVar265._0_4_ * 3.0;
          auVar215._4_4_ = auVar265._4_4_ * 3.0;
          auVar215._8_4_ = auVar265._8_4_ * 3.0;
          auVar215._12_4_ = auVar265._12_4_ * 3.0;
          auVar64 = vminps_avx(auVar201,auVar215);
          auVar265 = vmaxps_avx(auVar201,auVar215);
          auVar64 = vminps_avx(auVar185,auVar64);
          auVar265 = vmaxps_avx(auVar185,auVar265);
          auVar63 = vshufpd_avx(auVar64,auVar64,3);
          auVar95 = vshufpd_avx(auVar265,auVar265,3);
          auVar64 = vminps_avx(auVar64,auVar63);
          auVar265 = vmaxps_avx(auVar265,auVar95);
          auVar202._0_4_ = auVar64._0_4_ * fVar148;
          auVar202._4_4_ = auVar64._4_4_ * fVar148;
          auVar202._8_4_ = auVar64._8_4_ * fVar148;
          auVar202._12_4_ = auVar64._12_4_ * fVar148;
          auVar186._0_4_ = fVar148 * auVar265._0_4_;
          auVar186._4_4_ = fVar148 * auVar265._4_4_;
          auVar186._8_4_ = fVar148 * auVar265._8_4_;
          auVar186._12_4_ = fVar148 * auVar265._12_4_;
          fVar148 = 1.0 / (auVar118._0_4_ - auVar72._0_4_);
          auVar265 = vshufpd_avx(auVar73,auVar73,3);
          auVar64 = vshufpd_avx(auVar199,auVar199,3);
          auVar63 = vshufpd_avx(auVar74,auVar74,3);
          auVar95 = vshufpd_avx(auVar106,auVar106,3);
          auVar265 = vsubps_avx(auVar265,auVar73);
          auVar73 = vsubps_avx(auVar64,auVar199);
          auVar199 = vsubps_avx(auVar63,auVar74);
          auVar95 = vsubps_avx(auVar95,auVar106);
          auVar64 = vminps_avx(auVar265,auVar73);
          auVar265 = vmaxps_avx(auVar265,auVar73);
          auVar63 = vminps_avx(auVar199,auVar95);
          auVar63 = vminps_avx(auVar64,auVar63);
          auVar64 = vmaxps_avx(auVar199,auVar95);
          auVar265 = vmaxps_avx(auVar265,auVar64);
          auVar231._0_4_ = fVar148 * auVar63._0_4_;
          auVar231._4_4_ = fVar148 * auVar63._4_4_;
          auVar231._8_4_ = fVar148 * auVar63._8_4_;
          auVar231._12_4_ = fVar148 * auVar63._12_4_;
          auVar221._0_4_ = fVar148 * auVar265._0_4_;
          auVar221._4_4_ = fVar148 * auVar265._4_4_;
          auVar221._8_4_ = fVar148 * auVar265._8_4_;
          auVar221._12_4_ = fVar148 * auVar265._12_4_;
          auVar95 = vinsertps_avx(auVar8,auVar72,0x10);
          auVar73 = vinsertps_avx(auVar9,auVar118,0x10);
          auVar67._0_4_ = (auVar95._0_4_ + auVar73._0_4_) * 0.5;
          auVar67._4_4_ = (auVar95._4_4_ + auVar73._4_4_) * 0.5;
          auVar67._8_4_ = (auVar95._8_4_ + auVar73._8_4_) * 0.5;
          auVar67._12_4_ = (auVar95._12_4_ + auVar73._12_4_) * 0.5;
          auVar111._4_4_ = auVar67._0_4_;
          auVar111._0_4_ = auVar67._0_4_;
          auVar111._8_4_ = auVar67._0_4_;
          auVar111._12_4_ = auVar67._0_4_;
          auVar265 = vfmadd213ps_fma(local_3b0,auVar111,auVar10);
          auVar64 = vfmadd213ps_fma(local_3c0,auVar111,auVar11);
          auVar63 = vfmadd213ps_fma(local_3d0,auVar111,auVar12);
          auVar9 = vsubps_avx(auVar64,auVar265);
          auVar265 = vfmadd213ps_fma(auVar9,auVar111,auVar265);
          auVar9 = vsubps_avx(auVar63,auVar64);
          auVar9 = vfmadd213ps_fma(auVar9,auVar111,auVar64);
          auVar9 = vsubps_avx(auVar9,auVar265);
          auVar265 = vfmadd231ps_fma(auVar265,auVar9,auVar111);
          auVar112._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
          auVar112._8_4_ = auVar9._8_4_ * 3.0;
          auVar112._12_4_ = auVar9._12_4_ * 3.0;
          auVar216._8_8_ = auVar265._0_8_;
          auVar216._0_8_ = auVar265._0_8_;
          auVar9 = vshufpd_avx(auVar265,auVar265,3);
          auVar265 = vshufps_avx(auVar67,auVar67,0x55);
          auVar199 = vsubps_avx(auVar9,auVar216);
          auVar106 = vfmadd231ps_fma(auVar216,auVar265,auVar199);
          auVar254._8_8_ = auVar112._0_8_;
          auVar254._0_8_ = auVar112._0_8_;
          auVar9 = vshufpd_avx(auVar112,auVar112,3);
          auVar9 = vsubps_avx(auVar9,auVar254);
          auVar74 = vfmadd213ps_fma(auVar9,auVar265,auVar254);
          auVar265 = vmovshdup_avx(auVar74);
          auVar255._0_8_ = auVar265._0_8_ ^ 0x8000000080000000;
          auVar255._8_4_ = auVar265._8_4_ ^ 0x80000000;
          auVar255._12_4_ = auVar265._12_4_ ^ 0x80000000;
          auVar64 = vmovshdup_avx(auVar199);
          auVar9 = vunpcklps_avx(auVar64,auVar255);
          auVar63 = vshufps_avx(auVar9,auVar255,4);
          auVar272._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
          auVar272._8_4_ = auVar199._8_4_ ^ 0x80000000;
          auVar272._12_4_ = auVar199._12_4_ ^ 0x80000000;
          auVar9 = vmovlhps_avx(auVar272,auVar74);
          auVar9 = vshufps_avx(auVar9,auVar74,8);
          auVar265 = vfmsub231ss_fma(ZEXT416((uint)(auVar265._0_4_ * auVar199._0_4_)),auVar64,
                                     auVar74);
          auVar128._0_4_ = auVar265._0_4_;
          auVar128._4_4_ = auVar128._0_4_;
          auVar128._8_4_ = auVar128._0_4_;
          auVar128._12_4_ = auVar128._0_4_;
          auVar265 = vdivps_avx(auVar63,auVar128);
          auVar64 = vdivps_avx(auVar9,auVar128);
          fVar93 = auVar106._0_4_;
          fVar148 = auVar265._0_4_;
          auVar9 = vshufps_avx(auVar106,auVar106,0x55);
          fVar149 = auVar64._0_4_;
          local_700._4_4_ = fVar93 * auVar265._4_4_ + auVar9._4_4_ * auVar64._4_4_;
          local_700._0_4_ = fVar93 * fVar148 + auVar9._0_4_ * fVar149;
          uStack_6f8._0_4_ = fVar93 * auVar265._8_4_ + auVar9._8_4_ * auVar64._8_4_;
          uStack_6f8._4_4_ = fVar93 * auVar265._12_4_ + auVar9._12_4_ * auVar64._12_4_;
          auVar199 = vmovshdup_avx(auVar265);
          auVar9 = vinsertps_avx(auVar202,auVar231,0x1c);
          auVar266._0_4_ = auVar199._0_4_ * auVar9._0_4_;
          auVar266._4_4_ = auVar199._4_4_ * auVar9._4_4_;
          auVar266._8_4_ = auVar199._8_4_ * auVar9._8_4_;
          auVar266._12_4_ = auVar199._12_4_ * auVar9._12_4_;
          auVar63 = vinsertps_avx(auVar186,auVar221,0x1c);
          auVar240._0_4_ = auVar199._0_4_ * auVar63._0_4_;
          auVar240._4_4_ = auVar199._4_4_ * auVar63._4_4_;
          auVar240._8_4_ = auVar199._8_4_ * auVar63._8_4_;
          auVar240._12_4_ = auVar199._12_4_ * auVar63._12_4_;
          auVar119 = vminps_avx(auVar266,auVar240);
          auVar106 = vmaxps_avx(auVar240,auVar266);
          auVar199 = vinsertps_avx(auVar231,auVar202,0x4c);
          auVar123 = vmovshdup_avx(auVar64);
          auVar74 = vinsertps_avx(auVar221,auVar186,0x4c);
          auVar222._0_4_ = auVar123._0_4_ * auVar199._0_4_;
          auVar222._4_4_ = auVar123._4_4_ * auVar199._4_4_;
          auVar222._8_4_ = auVar123._8_4_ * auVar199._8_4_;
          auVar222._12_4_ = auVar123._12_4_ * auVar199._12_4_;
          auVar232._0_4_ = auVar123._0_4_ * auVar74._0_4_;
          auVar232._4_4_ = auVar123._4_4_ * auVar74._4_4_;
          auVar232._8_4_ = auVar123._8_4_ * auVar74._8_4_;
          auVar232._12_4_ = auVar123._12_4_ * auVar74._12_4_;
          auVar123 = vminps_avx(auVar222,auVar232);
          auVar84._0_4_ = auVar123._0_4_ + auVar119._0_4_;
          auVar84._4_4_ = auVar123._4_4_ + auVar119._4_4_;
          auVar84._8_4_ = auVar123._8_4_ + auVar119._8_4_;
          auVar84._12_4_ = auVar123._12_4_ + auVar119._12_4_;
          auVar119 = vmaxps_avx(auVar232,auVar222);
          auVar223._0_4_ = auVar106._0_4_ + auVar119._0_4_;
          auVar223._4_4_ = auVar106._4_4_ + auVar119._4_4_;
          auVar223._8_4_ = auVar106._8_4_ + auVar119._8_4_;
          auVar223._12_4_ = auVar106._12_4_ + auVar119._12_4_;
          auVar233._8_8_ = 0x3f80000000000000;
          auVar233._0_8_ = 0x3f80000000000000;
          auVar106 = vsubps_avx(auVar233,auVar223);
          auVar119 = vsubps_avx(auVar233,auVar84);
          auVar123 = vsubps_avx(auVar95,auVar67);
          auVar256._0_4_ = fVar148 * auVar9._0_4_;
          auVar256._4_4_ = fVar148 * auVar9._4_4_;
          auVar256._8_4_ = fVar148 * auVar9._8_4_;
          auVar256._12_4_ = fVar148 * auVar9._12_4_;
          auVar241._0_4_ = fVar148 * auVar63._0_4_;
          auVar241._4_4_ = fVar148 * auVar63._4_4_;
          auVar241._8_4_ = fVar148 * auVar63._8_4_;
          auVar241._12_4_ = fVar148 * auVar63._12_4_;
          auVar63 = vminps_avx(auVar256,auVar241);
          auVar9 = vmaxps_avx(auVar241,auVar256);
          auVar203._0_4_ = fVar149 * auVar199._0_4_;
          auVar203._4_4_ = fVar149 * auVar199._4_4_;
          auVar203._8_4_ = fVar149 * auVar199._8_4_;
          auVar203._12_4_ = fVar149 * auVar199._12_4_;
          auVar187._0_4_ = fVar149 * auVar74._0_4_;
          auVar187._4_4_ = fVar149 * auVar74._4_4_;
          auVar187._8_4_ = fVar149 * auVar74._8_4_;
          auVar187._12_4_ = fVar149 * auVar74._12_4_;
          auVar199 = vminps_avx(auVar203,auVar187);
          auVar257._0_4_ = auVar63._0_4_ + auVar199._0_4_;
          auVar257._4_4_ = auVar63._4_4_ + auVar199._4_4_;
          auVar257._8_4_ = auVar63._8_4_ + auVar199._8_4_;
          auVar257._12_4_ = auVar63._12_4_ + auVar199._12_4_;
          auVar199 = vsubps_avx(auVar73,auVar67);
          auVar63 = vmaxps_avx(auVar187,auVar203);
          fVar93 = auVar123._0_4_;
          auVar204._0_4_ = fVar93 * auVar106._0_4_;
          fVar94 = auVar123._4_4_;
          auVar204._4_4_ = fVar94 * auVar106._4_4_;
          fVar62 = auVar123._8_4_;
          auVar204._8_4_ = fVar62 * auVar106._8_4_;
          fVar174 = auVar123._12_4_;
          auVar204._12_4_ = fVar174 * auVar106._12_4_;
          auVar188._0_4_ = auVar9._0_4_ + auVar63._0_4_;
          auVar188._4_4_ = auVar9._4_4_ + auVar63._4_4_;
          auVar188._8_4_ = auVar9._8_4_ + auVar63._8_4_;
          auVar188._12_4_ = auVar9._12_4_ + auVar63._12_4_;
          auVar242._8_8_ = 0x3f800000;
          auVar242._0_8_ = 0x3f800000;
          auVar9 = vsubps_avx(auVar242,auVar188);
          auVar63 = vsubps_avx(auVar242,auVar257);
          auVar258._0_4_ = fVar93 * auVar119._0_4_;
          auVar258._4_4_ = fVar94 * auVar119._4_4_;
          auVar258._8_4_ = fVar62 * auVar119._8_4_;
          auVar258._12_4_ = fVar174 * auVar119._12_4_;
          fVar150 = auVar199._0_4_;
          auVar224._0_4_ = fVar150 * auVar106._0_4_;
          fVar151 = auVar199._4_4_;
          auVar224._4_4_ = fVar151 * auVar106._4_4_;
          fVar152 = auVar199._8_4_;
          auVar224._8_4_ = fVar152 * auVar106._8_4_;
          fVar153 = auVar199._12_4_;
          auVar224._12_4_ = fVar153 * auVar106._12_4_;
          auVar85._0_4_ = fVar150 * auVar119._0_4_;
          auVar85._4_4_ = fVar151 * auVar119._4_4_;
          auVar85._8_4_ = fVar152 * auVar119._8_4_;
          auVar85._12_4_ = fVar153 * auVar119._12_4_;
          auVar273._0_4_ = fVar93 * auVar9._0_4_;
          auVar273._4_4_ = fVar94 * auVar9._4_4_;
          auVar273._8_4_ = fVar62 * auVar9._8_4_;
          auVar273._12_4_ = fVar174 * auVar9._12_4_;
          auVar234._0_4_ = fVar93 * auVar63._0_4_;
          auVar234._4_4_ = fVar94 * auVar63._4_4_;
          auVar234._8_4_ = fVar62 * auVar63._8_4_;
          auVar234._12_4_ = fVar174 * auVar63._12_4_;
          auVar189._0_4_ = fVar150 * auVar9._0_4_;
          auVar189._4_4_ = fVar151 * auVar9._4_4_;
          auVar189._8_4_ = fVar152 * auVar9._8_4_;
          auVar189._12_4_ = fVar153 * auVar9._12_4_;
          auVar243._0_4_ = fVar150 * auVar63._0_4_;
          auVar243._4_4_ = fVar151 * auVar63._4_4_;
          auVar243._8_4_ = fVar152 * auVar63._8_4_;
          auVar243._12_4_ = fVar153 * auVar63._12_4_;
          auVar9 = vminps_avx(auVar273,auVar234);
          auVar63 = vminps_avx(auVar189,auVar243);
          auVar9 = vminps_avx(auVar9,auVar63);
          auVar63 = vmaxps_avx(auVar234,auVar273);
          auVar199 = vminps_avx(auVar204,auVar258);
          auVar74 = vminps_avx(auVar224,auVar85);
          auVar199 = vminps_avx(auVar199,auVar74);
          auVar9 = vhaddps_avx(auVar9,auVar199);
          auVar199 = vmaxps_avx(auVar243,auVar189);
          auVar63 = vmaxps_avx(auVar199,auVar63);
          auVar199 = vmaxps_avx(auVar258,auVar204);
          auVar74 = vmaxps_avx(auVar85,auVar224);
          auVar199 = vmaxps_avx(auVar74,auVar199);
          auVar63 = vhaddps_avx(auVar63,auVar199);
          auVar199 = vshufps_avx(auVar67,auVar67,0x54);
          auVar199 = vsubps_avx(auVar199,_local_700);
          auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
          auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
          auVar205._0_4_ = auVar199._0_4_ + auVar9._0_4_;
          auVar205._4_4_ = auVar199._4_4_ + auVar9._4_4_;
          auVar205._8_4_ = auVar199._8_4_ + auVar9._8_4_;
          auVar205._12_4_ = auVar199._12_4_ + auVar9._12_4_;
          auVar190._0_4_ = auVar199._0_4_ + auVar63._0_4_;
          auVar190._4_4_ = auVar199._4_4_ + auVar63._4_4_;
          auVar190._8_4_ = auVar199._8_4_ + auVar63._8_4_;
          auVar190._12_4_ = auVar199._12_4_ + auVar63._12_4_;
          auVar9 = vmaxps_avx(auVar95,auVar205);
          auVar63 = vminps_avx(auVar190,auVar73);
          auVar9 = vcmpps_avx(auVar63,auVar9,1);
          auVar9 = vshufps_avx(auVar9,auVar9,0x50);
          _local_780 = vinsertps_avx(auVar72,ZEXT416((uint)auVar118._0_4_),0x10);
          if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar9[0xf] < '\0') goto LAB_0165aae1;
          bVar56 = 0;
          if ((auVar172._0_4_ < auVar205._0_4_) && (bVar56 = 0, auVar190._0_4_ < auVar73._0_4_)) {
            auVar63 = vmovshdup_avx(auVar205);
            auVar9 = vcmpps_avx(auVar190,auVar73,1);
            bVar56 = auVar9[4] & auVar72._0_4_ < auVar63._0_4_;
          }
          if (((3 < (uint)uVar53 || fVar132 < 0.001) | bVar56) == 1) {
            lVar55 = 200;
            do {
              fVar62 = auVar199._0_4_;
              fVar94 = 1.0 - fVar62;
              fVar132 = fVar94 * fVar94 * fVar94;
              fVar93 = fVar62 * 3.0 * fVar94 * fVar94;
              fVar94 = fVar94 * fVar62 * fVar62 * 3.0;
              auVar144._4_4_ = fVar132;
              auVar144._0_4_ = fVar132;
              auVar144._8_4_ = fVar132;
              auVar144._12_4_ = fVar132;
              auVar102._4_4_ = fVar93;
              auVar102._0_4_ = fVar93;
              auVar102._8_4_ = fVar93;
              auVar102._12_4_ = fVar93;
              auVar86._4_4_ = fVar94;
              auVar86._0_4_ = fVar94;
              auVar86._8_4_ = fVar94;
              auVar86._12_4_ = fVar94;
              fVar62 = fVar62 * fVar62 * fVar62;
              auVar167._0_4_ = (float)local_580._0_4_ * fVar62;
              auVar167._4_4_ = (float)local_580._4_4_ * fVar62;
              auVar167._8_4_ = fStack_578 * fVar62;
              auVar167._12_4_ = fStack_574 * fVar62;
              auVar9 = vfmadd231ps_fma(auVar167,auVar12,auVar86);
              auVar9 = vfmadd231ps_fma(auVar9,auVar11,auVar102);
              auVar9 = vfmadd231ps_fma(auVar9,auVar10,auVar144);
              auVar87._8_8_ = auVar9._0_8_;
              auVar87._0_8_ = auVar9._0_8_;
              auVar9 = vshufpd_avx(auVar9,auVar9,3);
              auVar63 = vshufps_avx(auVar199,auVar199,0x55);
              auVar9 = vsubps_avx(auVar9,auVar87);
              auVar63 = vfmadd213ps_fma(auVar9,auVar63,auVar87);
              fVar132 = auVar63._0_4_;
              auVar9 = vshufps_avx(auVar63,auVar63,0x55);
              auVar88._0_4_ = fVar148 * fVar132 + fVar149 * auVar9._0_4_;
              auVar88._4_4_ = auVar265._4_4_ * fVar132 + auVar64._4_4_ * auVar9._4_4_;
              auVar88._8_4_ = auVar265._8_4_ * fVar132 + auVar64._8_4_ * auVar9._8_4_;
              auVar88._12_4_ = auVar265._12_4_ * fVar132 + auVar64._12_4_ * auVar9._12_4_;
              auVar199 = vsubps_avx(auVar199,auVar88);
              auVar9 = vandps_avx(auVar270,auVar63);
              auVar63 = vshufps_avx(auVar9,auVar9,0xf5);
              auVar9 = vmaxss_avx(auVar63,auVar9);
              if (auVar9._0_4_ < (float)local_3e0._0_4_) {
                local_120 = auVar199._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar9 = vmovshdup_avx(auVar199);
                  fVar132 = auVar9._0_4_;
                  if ((0.0 <= fVar132) && (fVar132 <= 1.0)) {
                    auVar265 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar119 = vinsertps_avx(auVar265,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                    m128[2]),0x28);
                    auVar265 = vdpps_avx(auVar119,local_590,0x7f);
                    auVar64 = vdpps_avx(auVar119,local_5a0,0x7f);
                    auVar63 = vdpps_avx(auVar119,local_3f0,0x7f);
                    auVar95 = vdpps_avx(auVar119,local_400,0x7f);
                    auVar73 = vdpps_avx(auVar119,local_410,0x7f);
                    auVar74 = vdpps_avx(auVar119,local_420,0x7f);
                    auVar106 = vdpps_avx(auVar119,local_430,0x7f);
                    auVar119 = vdpps_avx(auVar119,local_440,0x7f);
                    fVar148 = 1.0 - fVar132;
                    auVar265 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * auVar73._0_4_)),
                                               ZEXT416((uint)fVar148),auVar265);
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * fVar132)),
                                              ZEXT416((uint)fVar148),auVar64);
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * fVar132)),
                                              ZEXT416((uint)fVar148),auVar63);
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * auVar119._0_4_)),
                                              ZEXT416((uint)fVar148),auVar95);
                    fVar94 = 1.0 - local_120;
                    fVar148 = fVar94 * local_120 * local_120 * 3.0;
                    fVar174 = local_120 * local_120 * local_120;
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * auVar95._0_4_)),
                                              ZEXT416((uint)fVar148),auVar63);
                    fVar149 = local_120 * 3.0 * fVar94 * fVar94;
                    auVar64 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar149),auVar64);
                    fVar93 = fVar94 * fVar94 * fVar94;
                    auVar265 = vfmadd231ss_fma(auVar64,ZEXT416((uint)fVar93),auVar265);
                    auVar69 = ZEXT1632(auVar265);
                    fVar62 = auVar265._0_4_;
                    if (((fVar60 <= fVar62) &&
                        (fVar150 = *(float *)(ray + k * 4 + 0x100), fVar62 <= fVar150)) &&
                       (pGVar4 = (context->scene->geometries).items[uVar49].ptr,
                       (pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar64 = vshufps_avx(auVar199,auVar199,0x55);
                      auVar217._8_4_ = 0x3f800000;
                      auVar217._0_8_ = &DAT_3f8000003f800000;
                      auVar217._12_4_ = 0x3f800000;
                      auVar63 = vsubps_avx(auVar217,auVar64);
                      fVar151 = auVar64._0_4_;
                      auVar225._0_4_ = fVar151 * (float)local_5c0._0_4_;
                      fVar152 = auVar64._4_4_;
                      auVar225._4_4_ = fVar152 * (float)local_5c0._4_4_;
                      fVar153 = auVar64._8_4_;
                      auVar225._8_4_ = fVar153 * fStack_5b8;
                      fVar173 = auVar64._12_4_;
                      auVar225._12_4_ = fVar173 * fStack_5b4;
                      auVar235._0_4_ = fVar151 * (float)local_610._0_4_;
                      auVar235._4_4_ = fVar152 * (float)local_610._4_4_;
                      auVar235._8_4_ = fVar153 * fStack_608;
                      auVar235._12_4_ = fVar173 * fStack_604;
                      auVar244._0_4_ = fVar151 * (float)local_620._0_4_;
                      auVar244._4_4_ = fVar152 * (float)local_620._4_4_;
                      auVar244._8_4_ = fVar153 * fStack_618;
                      auVar244._12_4_ = fVar173 * fStack_614;
                      auVar206._0_4_ = fVar151 * (float)local_5e0._0_4_;
                      auVar206._4_4_ = fVar152 * (float)local_5e0._4_4_;
                      auVar206._8_4_ = fVar153 * fStack_5d8;
                      auVar206._12_4_ = fVar173 * fStack_5d4;
                      auVar64 = vfmadd231ps_fma(auVar225,auVar63,local_5b0);
                      auVar95 = vfmadd231ps_fma(auVar235,auVar63,local_5f0);
                      auVar73 = vfmadd231ps_fma(auVar244,auVar63,local_600);
                      auVar199 = vfmadd231ps_fma(auVar206,auVar63,local_5d0);
                      auVar64 = vsubps_avx(auVar95,auVar64);
                      auVar63 = vsubps_avx(auVar73,auVar95);
                      auVar95 = vsubps_avx(auVar199,auVar73);
                      auVar245._0_4_ = local_120 * auVar63._0_4_;
                      auVar245._4_4_ = local_120 * auVar63._4_4_;
                      auVar245._8_4_ = local_120 * auVar63._8_4_;
                      auVar245._12_4_ = local_120 * auVar63._12_4_;
                      auVar191._4_4_ = fVar94;
                      auVar191._0_4_ = fVar94;
                      auVar191._8_4_ = fVar94;
                      auVar191._12_4_ = fVar94;
                      auVar64 = vfmadd231ps_fma(auVar245,auVar191,auVar64);
                      auVar207._0_4_ = local_120 * auVar95._0_4_;
                      auVar207._4_4_ = local_120 * auVar95._4_4_;
                      auVar207._8_4_ = local_120 * auVar95._8_4_;
                      auVar207._12_4_ = local_120 * auVar95._12_4_;
                      auVar63 = vfmadd231ps_fma(auVar207,auVar191,auVar63);
                      auVar208._0_4_ = local_120 * auVar63._0_4_;
                      auVar208._4_4_ = local_120 * auVar63._4_4_;
                      auVar208._8_4_ = local_120 * auVar63._8_4_;
                      auVar208._12_4_ = local_120 * auVar63._12_4_;
                      auVar63 = vfmadd231ps_fma(auVar208,auVar191,auVar64);
                      auVar168._0_4_ = fVar174 * (float)local_490._0_4_;
                      auVar168._4_4_ = fVar174 * (float)local_490._4_4_;
                      auVar168._8_4_ = fVar174 * fStack_488;
                      auVar168._12_4_ = fVar174 * fStack_484;
                      auVar113._4_4_ = fVar148;
                      auVar113._0_4_ = fVar148;
                      auVar113._8_4_ = fVar148;
                      auVar113._12_4_ = fVar148;
                      auVar64 = vfmadd132ps_fma(auVar113,auVar168,local_480);
                      auVar145._4_4_ = fVar149;
                      auVar145._0_4_ = fVar149;
                      auVar145._8_4_ = fVar149;
                      auVar145._12_4_ = fVar149;
                      auVar64 = vfmadd132ps_fma(auVar145,auVar64,local_470);
                      auVar169._0_4_ = auVar63._0_4_ * 3.0;
                      auVar169._4_4_ = auVar63._4_4_ * 3.0;
                      auVar169._8_4_ = auVar63._8_4_ * 3.0;
                      auVar169._12_4_ = auVar63._12_4_ * 3.0;
                      auVar129._4_4_ = fVar93;
                      auVar129._0_4_ = fVar93;
                      auVar129._8_4_ = fVar93;
                      auVar129._12_4_ = fVar93;
                      auVar63 = vfmadd132ps_fma(auVar129,auVar64,local_460);
                      auVar64 = vshufps_avx(auVar169,auVar169,0xc9);
                      auVar114._0_4_ = auVar63._0_4_ * auVar64._0_4_;
                      auVar114._4_4_ = auVar63._4_4_ * auVar64._4_4_;
                      auVar114._8_4_ = auVar63._8_4_ * auVar64._8_4_;
                      auVar114._12_4_ = auVar63._12_4_ * auVar64._12_4_;
                      auVar64 = vshufps_avx(auVar63,auVar63,0xc9);
                      auVar64 = vfmsub231ps_fma(auVar114,auVar169,auVar64);
                      local_140 = auVar64._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar62;
                        uVar61 = vextractps_avx(auVar64,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar61;
                        uVar61 = vextractps_avx(auVar64,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar61;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar132;
                        *(uint *)(ray + k * 4 + 0x220) = uVar3;
                        *(uint *)(ray + k * 4 + 0x240) = uVar49;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100._0_8_ = auVar9._0_8_;
                        local_100._8_8_ = local_100._0_8_;
                        local_100._16_8_ = local_100._0_8_;
                        local_100._24_8_ = local_100._0_8_;
                        auVar9 = vmovshdup_avx(auVar64);
                        local_180 = auVar9._0_8_;
                        auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
                        local_160 = auVar9._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = CONCAT44(uStack_33c,local_340);
                        uStack_d8 = CONCAT44(uStack_334,uStack_338);
                        uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_c8 = CONCAT44(uStack_324,uStack_328);
                        local_c0 = CONCAT44(uStack_31c,local_320);
                        uStack_b8 = CONCAT44(uStack_314,uStack_318);
                        uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                        uStack_a8 = CONCAT44(uStack_304,uStack_308);
                        auVar14 = vpcmpeqd_avx2(local_100,local_100);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar62;
                        local_4c0 = local_360._0_8_;
                        uStack_4b8 = local_360._8_8_;
                        uStack_4b0 = local_360._16_8_;
                        uStack_4a8 = local_360._24_8_;
                        local_650.valid = (int *)&local_4c0;
                        local_650.geometryUserPtr = pGVar4->userPtr;
                        local_650.context = context->user;
                        local_650.hit = (RTCHitN *)&local_180;
                        local_650.N = 8;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar69 = ZEXT1632(auVar265);
                          (*pGVar4->intersectionFilterN)(&local_650);
                          auVar92._8_56_ = extraout_var;
                          auVar92._0_8_ = extraout_XMM1_Qa;
                          auVar14 = vpcmpeqd_avx2(auVar92._0_32_,auVar92._0_32_);
                        }
                        auVar44._8_8_ = uStack_4b8;
                        auVar44._0_8_ = local_4c0;
                        auVar44._16_8_ = uStack_4b0;
                        auVar44._24_8_ = uStack_4a8;
                        auVar71 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar44);
                        auVar70 = auVar14 & ~auVar71;
                        if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar70 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar70 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar70 >> 0x7f,0) == '\0') &&
                              (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar70 >> 0xbf,0) == '\0') &&
                            (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar70[0x1f]) {
                          auVar71 = auVar71 ^ auVar14;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar69 = ZEXT1632(auVar69._0_16_);
                            (*p_Var5)(&local_650);
                          }
                          auVar45._8_8_ = uStack_4b8;
                          auVar45._0_8_ = local_4c0;
                          auVar45._16_8_ = uStack_4b0;
                          auVar45._24_8_ = uStack_4a8;
                          auVar14 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar45
                                                 );
                          auVar70 = vpcmpeqd_avx2(auVar69,auVar69);
                          auVar71 = auVar14 ^ auVar70;
                          auVar69 = auVar70 & ~auVar14;
                          if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar69 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar69 >> 0x7f,0) != '\0') ||
                                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar69 >> 0xbf,0) != '\0') ||
                              (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar69[0x1f] < '\0') {
                            auVar91._0_4_ = auVar14._0_4_ ^ auVar70._0_4_;
                            auVar91._4_4_ = auVar14._4_4_ ^ auVar70._4_4_;
                            auVar91._8_4_ = auVar14._8_4_ ^ auVar70._8_4_;
                            auVar91._12_4_ = auVar14._12_4_ ^ auVar70._12_4_;
                            auVar91._16_4_ = auVar14._16_4_ ^ auVar70._16_4_;
                            auVar91._20_4_ = auVar14._20_4_ ^ auVar70._20_4_;
                            auVar91._24_4_ = auVar14._24_4_ ^ auVar70._24_4_;
                            auVar91._28_4_ = auVar14._28_4_ ^ auVar70._28_4_;
                            auVar69 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])local_650.hit);
                            *(undefined1 (*) [32])(local_650.ray + 0x180) = auVar69;
                            auVar69 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x20));
                            *(undefined1 (*) [32])(local_650.ray + 0x1a0) = auVar69;
                            auVar69 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x40));
                            *(undefined1 (*) [32])(local_650.ray + 0x1c0) = auVar69;
                            auVar69 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x60));
                            *(undefined1 (*) [32])(local_650.ray + 0x1e0) = auVar69;
                            auVar69 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                              (local_650.hit + 0x80));
                            *(undefined1 (*) [32])(local_650.ray + 0x200) = auVar69;
                            auVar69 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xa0));
                            *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar69;
                            auVar69 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xc0));
                            *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar69;
                            auVar69 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])
                                                               (local_650.hit + 0xe0));
                            *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar69;
                            auVar69 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])
                                                               (local_650.hit + 0x100));
                            *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar69;
                          }
                        }
                        if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar71 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar71 >> 0x7f,0) == '\0') &&
                              (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar71 >> 0xbf,0) == '\0') &&
                            (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar71[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar150;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar55 = lVar55 + -1;
            } while (lVar55 != 0);
          }
          else {
            bVar41 = false;
          }
        }
      }
    } while (bVar41);
    local_450 = vinsertps_avx(auVar8,ZEXT416((uint)fVar147),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }